

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  undefined4 *puVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  byte bVar5;
  ImWchar IVar6;
  ImFont *pIVar7;
  ImFontConfig *pIVar8;
  stbtt_fontinfo *info;
  undefined8 *puVar9;
  char cVar10;
  char cVar15;
  short sVar23;
  stbtt__buf fontdict;
  undefined1 auVar24 [14];
  unkuint10 Var25;
  undefined1 auVar26 [12];
  undefined1 auVar27 [16];
  unkbyte10 Var28;
  undefined1 auVar29 [13];
  undefined1 auVar30 [11];
  undefined1 auVar31 [15];
  undefined1 auVar32 [14];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  uint6 uVar38;
  stbtt__active_edge **ppsVar39;
  ushort uVar40;
  stbtt_uint32 sVar41;
  stbtt_uint32 sVar48;
  uint uVar49;
  int iVar50;
  int iVar51;
  uint uVar52;
  stbtt__active_edge *z_1;
  stbtt_uint32 sVar42;
  stbtt_uint32 sVar43;
  stbtt_uint32 sVar44;
  stbtt_uint32 sVar45;
  stbtt_uint32 sVar46;
  stbtt_uint32 sVar47;
  void *pvVar53;
  int *piVar54;
  void *pvVar55;
  stbrp_context *ptr;
  uchar *puVar56;
  void *pvVar57;
  long lVar58;
  stbtt__buf *scanline;
  stbtt__active_edge *psVar59;
  stbtt__buf *psVar60;
  undefined8 *puVar61;
  stbtt__active_edge *psVar62;
  ImWchar *pIVar63;
  ushort *puVar64;
  int x;
  ulong uVar66;
  int iVar65;
  ImFontConfig *pIVar67;
  long lVar68;
  int iVar69;
  stbtt__active_edge *z;
  ulong uVar70;
  ImU32 bit_n;
  int iVar71;
  long lVar72;
  ImFontAtlas *atlas_00;
  void *pvVar73;
  stbtt__edge *psVar74;
  ulong uVar75;
  ulong uVar76;
  uint *puVar77;
  stbrp_node **ppsVar78;
  byte *pbVar79;
  int iVar80;
  long lVar81;
  stbtt__edge *psVar82;
  ImFontConfig *pIVar83;
  bool bVar84;
  uint uVar85;
  ulong uVar86;
  ImU32 mask;
  uint uVar87;
  byte *pbVar88;
  stbtt_fontinfo *psVar89;
  bool bVar90;
  bool bVar91;
  byte bVar92;
  char cVar101;
  char cVar102;
  float fVar93;
  ushort uVar104;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  char cVar103;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar108;
  float fVar109;
  undefined1 auVar110 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar121;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar122;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar123;
  float fVar129;
  uint uVar130;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar131;
  uint uVar132;
  float fVar133;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  short sVar134;
  float fVar135;
  uint uVar143;
  float fVar144;
  uint uVar145;
  float fVar146;
  uint uVar147;
  float fVar148;
  undefined1 auVar141 [16];
  float fVar149;
  uint uVar154;
  uint uVar156;
  undefined1 auVar150 [16];
  float fVar155;
  float fVar157;
  uint uVar158;
  float fVar159;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  short sVar160;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  stbtt__buf sVar176;
  ImU32 *it_end;
  float y0_2;
  int y1;
  stbtt_uint32 charstrings;
  stbtt_uint32 fdarrayoff;
  ImVector<stbrp_rect> buf_rects;
  ImVector<ImFontBuildSrcData> src_tmp_array;
  ImVector<ImFontBuildDstData> dst_tmp_array;
  ImVector<stbtt_packedchar> buf_packedchars;
  int y0_1;
  int x0_1;
  int iy0;
  int x1_1;
  int x0;
  undefined4 in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb0c;
  int in_stack_fffffffffffffb14;
  uint *puVar177;
  undefined4 in_stack_fffffffffffffb34;
  undefined4 uVar178;
  int in_stack_fffffffffffffb3c;
  undefined4 uVar179;
  undefined1 local_4b8 [16];
  stbtt_uint32 local_49c;
  ImFontAtlas *local_498;
  long local_490;
  ulong local_488;
  undefined1 local_480 [32];
  stbrp_node *local_460;
  stbtt__edge *local_458;
  int local_44c;
  void *local_448;
  undefined8 local_440;
  int local_434;
  int local_430;
  float local_42c;
  undefined1 local_428 [8];
  void *pvStack_420;
  ulong local_410;
  long local_408;
  void *pvStack_400;
  ulong local_3f8;
  stbtt__active_edge *local_3f0;
  ulong local_3e8;
  float local_3dc;
  long local_3d8;
  void *pvStack_3d0;
  undefined8 *local_3c8;
  long local_3c0;
  ImFontConfig *local_3b8;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  long local_3a8;
  void *pvStack_3a0;
  uchar *local_390;
  ulong local_388;
  ulong local_380;
  long local_378;
  stbtt_fontinfo *local_370;
  long local_368;
  float *local_360;
  int local_358;
  uint local_354;
  uint local_350;
  uint local_34c;
  float local_348;
  int local_344;
  int local_340;
  int local_33c;
  stbrp_context *local_338;
  long local_330;
  float *local_328;
  ulong local_320;
  ulong local_318;
  ulong local_310;
  ulong local_308;
  ulong local_300;
  undefined1 local_2f8 [16];
  ImFontConfig *local_2e0;
  long local_2d8;
  size_t local_2d0;
  size_t local_2c8;
  uchar *local_2c0;
  ulong local_2b8;
  short *local_2b0;
  stbtt__edge *local_2a8;
  int local_2a0;
  int local_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [16];
  int local_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  stbtt__buf local_238 [32];
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined4 uVar136;
  undefined6 uVar137;
  undefined8 uVar138;
  undefined1 auVar139 [12];
  undefined1 auVar140 [14];
  undefined1 auVar142 [16];
  undefined4 uVar161;
  undefined6 uVar162;
  undefined8 uVar163;
  undefined1 auVar164 [12];
  undefined1 auVar165 [14];
  undefined1 auVar169 [16];
  
  uVar138 = local_4b8._0_8_;
  ImFontAtlasBuildInit(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  local_408 = 0;
  pvStack_400 = (void *)0x0;
  local_3d8 = 0;
  pvStack_3d0 = (void *)0x0;
  uVar49 = (atlas->ConfigData).Size;
  uVar86 = (ulong)(int)uVar49;
  if (0 < (long)uVar86) {
    uVar70 = 8;
    if (8 < uVar49) {
      uVar70 = (ulong)uVar49;
    }
    pvStack_400 = ImGui::MemAlloc(uVar70 * 0x110);
    local_408 = uVar70 << 0x20;
  }
  pvVar57 = pvStack_400;
  local_408 = CONCAT44(local_408._4_4_,uVar49);
  uVar49 = (atlas->Fonts).Size;
  if ((long)(int)uVar49 < 1) {
    pvVar53 = (void *)0x0;
  }
  else {
    uVar70 = 8;
    if (8 < uVar49) {
      uVar70 = (ulong)uVar49;
    }
    pvVar53 = ImGui::MemAlloc(uVar70 << 5);
    local_3d8 = uVar70 << 0x20;
    pvStack_3d0 = pvVar53;
  }
  local_3d8 = CONCAT44(local_3d8._4_4_,uVar49);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = local_4b8._0_8_;
  local_4b8 = auVar105 << 0x40;
  auVar105 = local_4b8;
  local_4b8._8_8_ = uVar138;
  memset(pvVar57,0,uVar86 * 0x110);
  memset(pvVar53,0,(long)(int)uVar49 << 5);
  local_498 = atlas;
  if (0 < (atlas->ConfigData).Size) {
    lVar81 = 0;
    local_4b8 = auVar105;
    do {
      pIVar67 = (local_498->ConfigData).Data + lVar81;
      lVar72 = lVar81 * 0x110;
      *(undefined4 *)((long)pvVar57 + lVar72 + 0xe0) = 0xffffffff;
      uVar70 = (ulong)(local_498->Fonts).Size;
      if ((long)uVar70 < 1) {
LAB_001a66a9:
        bVar90 = false;
        goto LAB_001a6676;
      }
      uVar66 = 0;
      while (pIVar7 = (local_498->Fonts).Data[uVar66], pIVar67->DstFont != pIVar7) {
        uVar66 = uVar66 + 1;
        bVar90 = false;
        if ((uVar70 <= uVar66) || (pIVar67->DstFont == pIVar7)) goto LAB_001a6676;
      }
      local_480._8_8_ = uVar86;
      *(int *)((long)pvVar57 + lVar72 + 0xe0) = (int)uVar66;
      pbVar88 = (byte *)pIVar67->FontData;
      iVar69 = pIVar67->FontNo;
      bVar92 = *pbVar88;
      sVar48 = 0xffffffff;
      if (bVar92 < 0x4f) {
        if (bVar92 == 0) {
          if (pbVar88[1] == 1) goto LAB_001a340e;
        }
        else if ((bVar92 == 0x31) && (pbVar88[1] == 0)) {
LAB_001a340e:
          if ((pbVar88[2] == 0) && (pbVar88[3] == 0)) {
LAB_001a347a:
            sVar48 = -(uint)(iVar69 != 0);
          }
        }
      }
      else if (bVar92 == 0x4f) {
        if (((pbVar88[1] == 0x54) && (pbVar88[2] == 0x54)) && (pbVar88[3] == 0x4f))
        goto LAB_001a347a;
      }
      else if (bVar92 == 0x74) {
        bVar92 = pbVar88[1];
        if (bVar92 == 0x72) {
          if ((pbVar88[2] == 0x75) && (pbVar88[3] == 0x65)) goto LAB_001a347a;
        }
        else if (bVar92 == 0x74) {
          if ((pbVar88[2] == 99) && (pbVar88[3] == 0x66)) {
            uVar49 = *(uint *)(pbVar88 + 4);
            uVar49 = uVar49 >> 0x18 | (uVar49 & 0xff0000) >> 8 | (uVar49 & 0xff00) << 8 |
                     uVar49 << 0x18;
            if (((uVar49 == 0x20000) || (uVar49 == 0x10000)) &&
               (uVar49 = *(uint *)(pbVar88 + 8),
               iVar69 < (int)(uVar49 >> 0x18 | (uVar49 & 0xff0000) >> 8 | (uVar49 & 0xff00) << 8 |
                             uVar49 << 0x18))) {
              uVar49 = *(uint *)(pbVar88 + (long)iVar69 * 4 + 0xc);
              sVar48 = uVar49 >> 0x18 | (uVar49 & 0xff0000) >> 8 | (uVar49 & 0xff00) << 8 |
                       uVar49 << 0x18;
            }
          }
        }
        else if (((bVar92 == 0x79) && (pbVar88[2] == 0x70)) && (pbVar88[3] == 0x31))
        goto LAB_001a347a;
      }
      *(byte **)((long)pvVar57 + lVar72 + 8) = pbVar88;
      *(stbtt_uint32 *)((long)pvVar57 + lVar72 + 0x10) = sVar48;
      *(undefined8 *)((long)pvVar57 + lVar72 + 0x40) = 0;
      *(undefined8 *)((long)pvVar57 + lVar72 + 0x48) = 0;
      local_3b8 = pIVar67;
      sVar41 = stbtt__find_table(pbVar88,sVar48,"cmap");
      uVar86 = (ulong)sVar41;
      sVar42 = stbtt__find_table(pbVar88,sVar48,"loca");
      *(stbtt_uint32 *)((long)pvVar57 + lVar72 + 0x18) = sVar42;
      sVar43 = stbtt__find_table(pbVar88,sVar48,"head");
      *(stbtt_uint32 *)((long)pvVar57 + lVar72 + 0x1c) = sVar43;
      sVar44 = stbtt__find_table(pbVar88,sVar48,"glyf");
      *(stbtt_uint32 *)((long)pvVar57 + lVar72 + 0x20) = sVar44;
      sVar45 = stbtt__find_table(pbVar88,sVar48,"hhea");
      *(stbtt_uint32 *)((long)pvVar57 + lVar72 + 0x24) = sVar45;
      sVar46 = stbtt__find_table(pbVar88,sVar48,"hmtx");
      *(stbtt_uint32 *)((long)pvVar57 + lVar72 + 0x28) = sVar46;
      sVar47 = stbtt__find_table(pbVar88,sVar48,"kern");
      *(stbtt_uint32 *)((long)pvVar57 + lVar72 + 0x2c) = sVar47;
      sVar47 = stbtt__find_table(pbVar88,sVar48,"GPOS");
      *(stbtt_uint32 *)((long)pvVar57 + lVar72 + 0x30) = sVar47;
      bVar90 = false;
      if (((sVar41 == 0) || (sVar43 == 0)) || ((sVar45 == 0 || (sVar46 == 0)))) goto LAB_001a6676;
      local_488 = uVar86;
      if (sVar44 == 0) {
        local_3a8 = CONCAT44(local_3a8._4_4_,2);
        local_480._0_8_ = local_480._0_8_ & 0xffffffff00000000;
        local_440._0_4_ = 0;
        local_49c = 0;
        sVar41 = stbtt__find_table(pbVar88,sVar48,"CFF ");
        if (sVar41 != 0) {
          *(undefined8 *)((long)pvVar57 + lVar72 + 0x90) = 0;
          *(undefined8 *)((long)pvVar57 + lVar72 + 0x98) = 0;
          *(undefined8 *)((long)pvVar57 + lVar72 + 0x80) = 0;
          *(undefined8 *)((long)pvVar57 + lVar72 + 0x88) = 0;
          *(byte **)((long)pvVar57 + lVar72 + 0x40) = pbVar88 + sVar41;
          *(undefined8 *)((long)pvVar57 + lVar72 + 0x48) = 0x2000000000000000;
          local_238[0].data = *(uchar **)((long)pvVar57 + lVar72 + 0x40);
          uVar138 = *(undefined8 *)((long)pvVar57 + lVar72 + 0x48);
          local_238[0].cursor = (int)uVar138;
          local_238[0].size = (int)((ulong)uVar138 >> 0x20);
          uVar49 = local_238[0].cursor + 2U;
          if (local_238[0].size < (int)(local_238[0].cursor + 2U)) {
            uVar49 = local_238[0].size;
          }
          if (local_238[0].cursor < -2) {
            uVar49 = local_238[0].size;
          }
          local_238[0].cursor = 0;
          if ((int)uVar49 < local_238[0].size) {
            local_238[0].cursor = (int)local_238[0].data[(int)uVar49];
          }
          if (local_238[0].size < local_238[0].cursor) {
            local_238[0].cursor = local_238[0].size;
          }
          stbtt__cff_get_index(local_238);
          sVar176 = stbtt__cff_get_index(local_238);
          _local_428 = stbtt__cff_index_get(sVar176,0);
          stbtt__cff_get_index(local_238);
          sVar176 = stbtt__cff_get_index(local_238);
          *(stbtt__buf *)((long)pvVar57 + lVar72 + 0x60) = sVar176;
          stbtt__dict_get_ints((stbtt__buf *)local_428,0x11,1,(stbtt_uint32 *)local_480);
          stbtt__dict_get_ints((stbtt__buf *)local_428,0x106,1,(stbtt_uint32 *)&local_3a8);
          stbtt__dict_get_ints((stbtt__buf *)local_428,0x124,1,(stbtt_uint32 *)&local_440);
          stbtt__dict_get_ints((stbtt__buf *)local_428,0x125,1,&local_49c);
          uVar138 = local_238[0]._8_8_;
          sVar176.data._4_4_ = in_stack_fffffffffffffb0c;
          sVar176.data._0_4_ = in_stack_fffffffffffffb08;
          sVar176.cursor = sVar48;
          sVar176.size = in_stack_fffffffffffffb14;
          fontdict.data._4_4_ = in_stack_fffffffffffffb34;
          fontdict.data._0_4_ = sVar44;
          fontdict.cursor = sVar43;
          fontdict.size = in_stack_fffffffffffffb3c;
          sVar176 = stbtt__get_subrs(sVar176,fontdict);
          sVar41 = local_49c;
          *(stbtt__buf *)((long)pvVar57 + lVar72 + 0x70) = sVar176;
          if (((stbtt_uint32)local_3a8 == 2) && (uVar136 = local_480._0_4_, local_480._0_4_ != 0)) {
            sVar42 = SUB84(uVar138,4);
            if ((stbtt_uint32)local_440 != 0) {
              uVar86 = (ulong)local_49c;
              if (uVar86 == 0) goto LAB_001a66a9;
              sVar44 = (stbtt_uint32)local_440;
              if ((int)sVar42 < (int)(stbtt_uint32)local_440) {
                sVar44 = sVar42;
              }
              if ((int)(stbtt_uint32)local_440 < 0) {
                sVar44 = sVar42;
              }
              local_238[0].cursor = sVar44;
              sVar176 = stbtt__cff_get_index(local_238);
              *(stbtt__buf *)((long)pvVar57 + lVar72 + 0x80) = sVar176;
              puVar56 = local_238[0].data + uVar86;
              lVar68 = (ulong)(local_238[0].size - sVar41) << 0x20;
              if ((int)(local_238[0].size - sVar41 | sVar41) < 0 || local_238[0].size < (int)sVar41)
              {
                puVar56 = (uchar *)0x0;
                lVar68 = 0;
              }
              *(uchar **)((long)pvVar57 + lVar72 + 0x90) = puVar56;
              *(long *)((long)pvVar57 + lVar72 + 0x98) = lVar68;
              sVar42 = local_238[0].size;
            }
            auVar126._8_8_ = 0;
            auVar126._0_8_ = local_4b8._8_8_;
            local_4b8 = auVar126 << 0x40;
            sVar41 = uVar136;
            if ((int)sVar42 < (int)uVar136) {
              sVar41 = sVar42;
            }
            if ((int)uVar136 < 0) {
              sVar41 = sVar42;
            }
            local_238[0].cursor = sVar41;
            sVar176 = stbtt__cff_get_index(local_238);
            *(stbtt__buf *)((long)pvVar57 + lVar72 + 0x50) = sVar176;
            goto LAB_001a3836;
          }
        }
        goto LAB_001a66a9;
      }
      if (sVar42 == 0) goto LAB_001a66a9;
LAB_001a3836:
      sVar48 = stbtt__find_table(pbVar88,sVar48,"maxp");
      if (sVar48 == 0) {
        uVar49 = 0xffff;
      }
      else {
        uVar49 = (uint)(ushort)(*(ushort *)(pbVar88 + (ulong)sVar48 + 4) << 8 |
                               *(ushort *)(pbVar88 + (ulong)sVar48 + 4) >> 8);
      }
      *(uint *)((long)pvVar57 + lVar72 + 0x14) = uVar49;
      *(undefined4 *)((long)pvVar57 + lVar72 + 0x34) = 0xffffffff;
      uVar40 = *(ushort *)(pbVar88 + (local_488 & 0xffffffff) + 2) << 8 |
               *(ushort *)(pbVar88 + (local_488 & 0xffffffff) + 2) >> 8;
      *(undefined4 *)((long)pvVar57 + lVar72 + 0x38) = 0;
      iVar69 = 0;
      bVar90 = false;
      if (uVar40 == 0) goto LAB_001a6676;
      uVar49 = (int)local_488 + 4;
      uVar86 = (ulong)uVar40;
      do {
        uVar40 = *(ushort *)(pbVar88 + uVar49) << 8 | *(ushort *)(pbVar88 + uVar49) >> 8;
        if ((uVar40 == 0) ||
           ((uVar40 == 3 &&
            ((uVar40 = *(ushort *)(pbVar88 + (ulong)uVar49 + 2) << 8 |
                       *(ushort *)(pbVar88 + (ulong)uVar49 + 2) >> 8, uVar40 == 10 || (uVar40 == 1))
            )))) {
          uVar87 = *(uint *)(pbVar88 + (ulong)uVar49 + 4);
          iVar69 = (uVar87 >> 0x18 | (uVar87 & 0xff0000) >> 8 | (uVar87 & 0xff00) << 8 |
                   uVar87 << 0x18) + (int)local_488;
          *(int *)((long)pvVar57 + lVar72 + 0x38) = iVar69;
        }
        uVar49 = uVar49 + 8;
        uVar86 = uVar86 - 1;
      } while (uVar86 != 0);
      if (iVar69 == 0) goto LAB_001a66a9;
      *(uint *)((long)pvVar57 + lVar72 + 0x3c) =
           (uint)(ushort)(*(ushort *)(pbVar88 + (long)(int)sVar43 + 0x32) << 8 |
                         *(ushort *)(pbVar88 + (long)(int)sVar43 + 0x32) >> 8);
      pIVar63 = local_3b8->GlyphRanges;
      if (pIVar63 == (ImWchar *)0x0) {
        pIVar63 = ImFontAtlas::GetGlyphRangesDefault::ranges;
      }
      *(ImWchar **)((long)pvVar57 + lVar72 + 0xd8) = pIVar63;
      IVar6 = *pIVar63;
      while (IVar6 != 0) {
        uVar40 = pIVar63[1];
        if (uVar40 == 0) break;
        uVar49 = *(uint *)((long)pvVar57 + lVar72 + 0xe4);
        uVar87 = (uint)uVar40;
        if ((int)(uint)uVar40 < (int)uVar49) {
          uVar87 = uVar49;
        }
        *(uint *)((long)pvVar57 + lVar72 + 0xe4) = uVar87;
        IVar6 = pIVar63[2];
        pIVar63 = pIVar63 + 2;
      }
      piVar54 = (int *)((long)*(int *)((long)pvVar57 + lVar72 + 0xe0) * 0x20 + (long)pvVar53);
      *piVar54 = *piVar54 + 1;
      iVar69 = *(int *)((long)pvVar57 + lVar72 + 0xe4);
      if (iVar69 < piVar54[1]) {
        iVar69 = piVar54[1];
      }
      piVar54[1] = iVar69;
      lVar81 = lVar81 + 1;
      uVar86 = local_480._8_8_;
    } while (lVar81 < (local_498->ConfigData).Size);
  }
  local_4b8._0_8_ = 0;
  if ((int)uVar86 < 1) {
LAB_001a3c9b:
    local_488 = 0;
  }
  else {
    lVar81 = 0;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = local_4b8._8_8_;
    local_4b8 = auVar116 << 0x40;
    do {
      local_480._8_8_ = lVar81;
      lVar81 = lVar81 * 0x110;
      pvVar53 = (void *)((long)*(int *)((long)pvVar57 + lVar81 + 0xe0) * 0x20 + (long)pvStack_3d0);
      ImBitVector::Create((ImBitVector *)((long)pvVar57 + lVar81 + 0xf0),
                          *(int *)((long)pvVar57 + lVar81 + 0xe4) + 1);
      if (*(int *)((long)pvVar53 + 0x10) == 0) {
        ImBitVector::Create((ImBitVector *)((long)pvVar53 + 0x10),*(int *)((long)pvVar53 + 4) + 1);
      }
      puVar64 = *(ushort **)((long)pvVar57 + lVar81 + 0xd8);
      uVar40 = *puVar64;
      while ((uVar40 != 0 && (uVar104 = puVar64[1], uVar104 != 0))) {
        uVar136 = SUB84(puVar64,0);
        uVar161 = (undefined4)((ulong)puVar64 >> 0x20);
        if (uVar40 <= uVar104) {
          uVar49 = (uint)uVar40;
          lVar72 = *(long *)((long)pvVar53 + 0x18);
          do {
            auVar105 = local_4b8;
            uVar87 = 1 << ((byte)uVar49 & 0x1f);
            if (((*(uint *)(lVar72 + (ulong)(uVar49 >> 5) * 4) >> (uVar49 & 0x1f) & 1) == 0) &&
               (iVar69 = stbtt_FindGlyphIndex
                                   (*(stbtt_fontinfo **)((long)pvVar57 + lVar81 + 8),
                                    *(int *)((long)pvVar57 + lVar81 + 0x38)), iVar69 != 0)) {
              piVar54 = (int *)((long)pvVar57 + lVar81 + 0xe8);
              *piVar54 = *piVar54 + 1;
              *(int *)((long)pvVar53 + 8) = *(int *)((long)pvVar53 + 8) + 1;
              uVar86 = (ulong)((uVar49 >> 5) << 2);
              puVar77 = (uint *)(*(long *)((long)pvVar57 + lVar81 + 0xf8) + uVar86);
              *puVar77 = *puVar77 | uVar87;
              puVar77 = (uint *)(lVar72 + uVar86);
              *puVar77 = *puVar77 | uVar87;
              iVar69 = local_4b8._0_4_;
              local_4b8._4_4_ = 0;
              local_4b8._0_4_ = iVar69 + 1;
              local_4b8._8_8_ = auVar105._8_8_;
            }
            uVar49 = uVar49 + 1;
          } while (uVar104 + 1 != uVar49);
        }
        uVar40 = *(ushort *)(CONCAT44(uVar161,uVar136) + 4);
        puVar64 = (ushort *)(CONCAT44(uVar161,uVar136) + 4);
      }
      lVar81 = local_480._8_8_ + 1;
      uVar86 = (ulong)(int)local_408;
    } while (lVar81 < (long)uVar86);
    local_488 = CONCAT71((int7)((ulong)lVar81 >> 8),0 < (int)local_408);
    if ((int)local_408 < 1) goto LAB_001a3c9b;
    uVar70 = 0;
    do {
      local_480._8_8_ = uVar86;
      lVar81 = uVar70 * 0x110;
      iVar69 = *(int *)((long)pvVar57 + lVar81 + 0xe8);
      if (*(int *)((long)pvVar57 + lVar81 + 0x104) < iVar69) {
        pvVar55 = ImGui::MemAlloc((long)iVar69 << 2);
        pvVar53 = *(void **)((long)pvVar57 + lVar81 + 0x108);
        if (pvVar53 != (void *)0x0) {
          memcpy(pvVar55,pvVar53,(long)*(int *)((long)pvVar57 + lVar81 + 0x100) << 2);
          ImGui::MemFree(*(void **)((long)pvVar57 + lVar81 + 0x108));
        }
        *(void **)((long)pvVar57 + lVar81 + 0x108) = pvVar55;
        *(int *)((long)pvVar57 + lVar81 + 0x104) = iVar69;
      }
      lVar72 = (long)*(int *)((long)pvVar57 + lVar81 + 0xf0);
      puVar77 = *(uint **)((long)pvVar57 + lVar81 + 0xf8);
      if (0 < lVar72) {
        uVar136 = (undefined4)uVar70;
        uVar161 = (undefined4)(uVar70 >> 0x20);
        puVar177 = puVar77 + lVar72;
        iVar69 = 0;
        do {
          uVar178 = SUB84(puVar77,0);
          uVar179 = (undefined4)((ulong)puVar77 >> 0x20);
          uVar49 = *puVar77;
          if (uVar49 != 0) {
            uVar87 = 0;
            do {
              if ((uVar49 >> (uVar87 & 0x1f) & 1) != 0) {
                iVar80 = *(int *)((long)pvVar57 + lVar81 + 0x100);
                if (iVar80 == *(int *)((long)pvVar57 + lVar81 + 0x104)) {
                  if (iVar80 == 0) {
                    iVar50 = 8;
                  }
                  else {
                    iVar50 = iVar80 / 2 + iVar80;
                  }
                  iVar71 = iVar80 + 1;
                  if (iVar80 + 1 < iVar50) {
                    iVar71 = iVar50;
                  }
                  pvVar53 = ImGui::MemAlloc((long)iVar71 << 2);
                  pvVar55 = *(void **)((long)pvVar57 + lVar81 + 0x108);
                  if (pvVar55 != (void *)0x0) {
                    memcpy(pvVar53,pvVar55,(long)*(int *)((long)pvVar57 + lVar81 + 0x100) << 2);
                    ImGui::MemFree(*(void **)((long)pvVar57 + lVar81 + 0x108));
                  }
                  *(void **)((long)pvVar57 + lVar81 + 0x108) = pvVar53;
                  *(int *)((long)pvVar57 + lVar81 + 0x104) = iVar71;
                  iVar80 = *(int *)((long)pvVar57 + lVar81 + 0x100);
                }
                else {
                  pvVar53 = *(void **)((long)pvVar57 + lVar81 + 0x108);
                }
                *(uint *)((long)pvVar53 + (long)iVar80 * 4) = iVar69 + uVar87;
                piVar54 = (int *)((long)pvVar57 + lVar81 + 0x100);
                *piVar54 = *piVar54 + 1;
              }
              uVar87 = uVar87 + 1;
            } while (uVar87 != 0x20);
          }
          puVar77 = (uint *)(CONCAT44(uVar179,uVar178) + 4);
          iVar69 = iVar69 + 0x20;
        } while (puVar77 < puVar177);
        puVar77 = *(uint **)((long)pvVar57 + lVar81 + 0xf8);
        uVar70 = CONCAT44(uVar161,uVar136);
      }
      if (puVar77 != (uint *)0x0) {
        *(undefined8 *)((long)pvVar57 + lVar81 + 0xf0) = 0;
        ImGui::MemFree(puVar77);
        *(undefined8 *)((long)pvVar57 + lVar81 + 0xf8) = 0;
      }
      uVar70 = uVar70 + 1;
      uVar86 = local_480._8_8_;
    } while (uVar70 < (ulong)local_480._8_8_);
  }
  pvVar53 = pvStack_3d0;
  atlas_00 = local_498;
  uVar70 = (ulong)(int)local_3d8;
  if ((long)uVar70 < 1) {
    if (pvStack_3d0 != (void *)0x0) goto LAB_001a3cef;
  }
  else {
    puVar61 = (undefined8 *)((long)pvStack_3d0 + 0x18);
    uVar66 = 0;
    do {
      if ((void *)*puVar61 != (void *)0x0) {
        puVar61[-1] = 0;
        ImGui::MemFree((void *)*puVar61);
        *puVar61 = 0;
      }
      uVar66 = uVar66 + 1;
      puVar61 = puVar61 + 4;
    } while (uVar66 < uVar70);
LAB_001a3cef:
    local_3d8 = 0;
    ImGui::MemFree(pvVar53);
    pvStack_3d0 = (void *)0x0;
  }
  _local_428 = (stbtt__buf)ZEXT816(0);
  local_3a8 = 0;
  pvStack_3a0 = (void *)0x0;
  uVar49 = (uint)local_4b8._0_8_;
  if ((int)uVar49 < 1) {
    local_428._0_4_ = uVar49;
    pvVar53 = (void *)0x0;
  }
  else {
    uVar70 = 8;
    if (8 < uVar49) {
      uVar70 = local_4b8._0_8_ & 0xffffffff;
    }
    pvVar53 = ImGui::MemAlloc(uVar70 * 0x18);
    pvStack_420 = pvVar53;
    local_428._4_4_ = (int)uVar70;
    uVar70 = 8;
    if (8 < uVar49) {
      uVar70 = local_4b8._0_8_ & 0xffffffff;
    }
    local_428._0_4_ = uVar49;
    pvStack_3a0 = ImGui::MemAlloc(uVar70 * 0x1c);
    local_3a8 = uVar70 << 0x20;
  }
  pvVar55 = pvStack_3a0;
  local_3a8 = CONCAT44(local_3a8._4_4_,uVar49);
  iVar69 = 0;
  memset(pvVar53,0,(long)(int)(uVar49 * 0x18));
  memset(pvVar55,0,(long)(int)(uVar49 * 0x1c));
  fVar93 = 0.0;
  if ((char)local_488 != '\0') {
    pIVar83 = (ImFontConfig *)(uVar86 & 0xffffffff);
    pIVar67 = (ImFontConfig *)0x0;
    iVar80 = 0;
    iVar50 = 0;
    local_480._8_8_ = uVar86;
    local_3b8 = pIVar83;
    do {
      iVar71 = *(int *)((long)pvVar57 + (long)pIVar67 * 0x110 + 0xe8);
      if (iVar71 != 0) {
        psVar89 = (stbtt_fontinfo *)((long)pIVar67 * 0x110 + (long)pvVar57);
        *(void **)&psVar89[1].hmtx = (void *)((long)pvVar53 + (long)iVar80 * 0x18);
        pvVar73 = (void *)((long)iVar50 * 0x1c + (long)pvVar55);
        *(void **)&psVar89[1].gpos = pvVar73;
        pIVar8 = (atlas_00->ConfigData).Data;
        fVar93 = pIVar8[(long)pIVar67].SizePixels;
        fVar109 = pIVar8[(long)pIVar67].RasterizerDensity;
        fVar108 = fVar93 * fVar109;
        *(float *)&psVar89[1].userdata = fVar108;
        *(undefined4 *)((long)&psVar89[1].userdata + 4) = 0;
        psVar89[1].data = *(uchar **)&psVar89[1].gsubrs.cursor;
        iVar51 = *(int *)&psVar89[1].gsubrs.data;
        psVar89[1].fontstart = iVar51;
        *(void **)&psVar89[1].loca = pvVar73;
        *(char *)&psVar89[1].glyf = (char)pIVar8[(long)pIVar67].OversampleH;
        *(char *)((long)&psVar89[1].glyf + 1) = (char)pIVar8[(long)pIVar67].OversampleV;
        if (fVar93 <= 0.0) {
          fVar108 = (fVar109 * -fVar93) /
                    (float)(ushort)(*(ushort *)(psVar89->data + (long)psVar89->head + 0x12) << 8 |
                                   *(ushort *)(psVar89->data + (long)psVar89->head + 0x12) >> 8);
        }
        else {
          puVar56 = psVar89->data;
          lVar81 = (long)psVar89->hhea;
          fVar108 = fVar108 / (float)(int)(((int)(short)((ushort)puVar56[lVar81 + 4] << 8) |
                                           (uint)puVar56[lVar81 + 5]) -
                                          ((int)(short)((ushort)puVar56[lVar81 + 6] << 8) |
                                          (uint)puVar56[lVar81 + 7]));
        }
        iVar80 = iVar80 + iVar71;
        iVar50 = iVar50 + iVar71;
        if (iVar51 < 1) {
          uVar86 = local_480._8_8_;
        }
        else {
          iVar71 = atlas_00->TexGlyphPadding + -1;
          lVar81 = 2;
          lVar72 = 0;
          pIVar83 = pIVar67;
          do {
            iVar51 = stbtt_FindGlyphIndex((stbtt_fontinfo *)psVar89->data,psVar89->index_map);
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar89,iVar51,(float)pIVar8[(long)pIVar67].OversampleH * fVar108,
                       (float)pIVar8[(long)pIVar67].OversampleV * fVar108,fVar108,in_XMM3._0_4_,
                       (int *)local_238,(int *)local_480,(int *)&local_440,(int *)&local_49c);
            iVar51 = (((stbtt_uint32)local_440 + iVar71) - (int)local_238[0].data) +
                     pIVar8[(long)pIVar67].OversampleH;
            lVar68 = *(long *)&psVar89[1].hmtx;
            *(int *)(lVar68 + -4 + lVar81 * 4) = iVar51;
            iVar65 = ((local_49c + iVar71) - local_480._0_4_) + pIVar8[(long)pIVar67].OversampleV;
            *(int *)(lVar68 + lVar81 * 4) = iVar65;
            iVar69 = iVar69 + iVar65 * iVar51;
            lVar72 = lVar72 + 1;
            lVar81 = lVar81 + 6;
          } while (lVar72 < *(int *)&psVar89[1].gsubrs.data);
          pIVar67 = pIVar83;
          atlas_00 = local_498;
          pIVar83 = local_3b8;
          uVar86 = local_480._8_8_;
        }
      }
      pIVar67 = (ImFontConfig *)((long)&pIVar67->FontData + 1);
    } while (pIVar67 < pIVar83);
    fVar93 = (float)iVar69;
  }
  if (fVar93 < 0.0) {
    fVar93 = sqrtf(fVar93);
  }
  else {
    fVar93 = SQRT(fVar93);
  }
  atlas_00->TexHeight = 0;
  iVar69 = atlas_00->TexDesiredWidth;
  if (iVar69 < 1) {
    iVar80 = (int)fVar93;
    iVar69 = 0x1000;
    if ((iVar80 < 0xb33) && (iVar69 = 0x800, iVar80 < 0x599)) {
      iVar69 = (uint)(0x2cb < iVar80) * 0x200 + 0x200;
    }
  }
  atlas_00->TexWidth = iVar69;
  iVar80 = atlas_00->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  uVar49 = iVar69 - iVar80;
  local_460 = (stbrp_node *)ImGui::MemAlloc((long)(int)uVar49 << 4);
  auVar126 = _DAT_001f2600;
  auVar105 = _DAT_001e93b0;
  if ((ptr == (stbrp_context *)0x0) || (local_460 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (local_460 != (stbrp_node *)0x0) {
      ImGui::MemFree(local_460);
    }
    local_460 = (stbrp_node *)0x0;
    iVar80 = 0;
    iVar69 = 0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    uVar70 = (ulong)(uVar49 - 1);
    if ((int)uVar49 < 2) {
      uVar70 = 0;
    }
    else {
      uVar66 = (ulong)(uVar49 & 0x7ffffffe);
      lVar81 = uVar70 - 1;
      auVar94._8_4_ = (int)lVar81;
      auVar94._0_8_ = lVar81;
      auVar94._12_4_ = (int)((ulong)lVar81 >> 0x20);
      ppsVar78 = &local_460[1].next;
      auVar94 = auVar94 ^ _DAT_001e93b0;
      auVar111._8_4_ = 0xffffffff;
      auVar111._0_8_ = 0xffffffffffffffff;
      auVar111._12_4_ = 0xffffffff;
      auVar150 = _DAT_001e96a0;
      do {
        auVar116 = auVar150 ^ auVar105;
        auVar124._0_4_ = -(uint)(auVar94._0_4_ < auVar116._0_4_);
        auVar124._4_4_ = -(uint)(auVar94._4_4_ < auVar116._4_4_);
        auVar124._8_4_ = -(uint)(auVar94._8_4_ < auVar116._8_4_);
        auVar124._12_4_ = -(uint)(auVar94._12_4_ < auVar116._12_4_);
        auVar117._4_4_ = -(uint)(auVar116._4_4_ == auVar94._4_4_);
        auVar117._12_4_ = -(uint)(auVar116._12_4_ == auVar94._12_4_);
        auVar117._0_4_ = auVar117._4_4_;
        auVar117._8_4_ = auVar117._12_4_;
        auVar125._4_4_ = auVar124._4_4_;
        auVar125._0_4_ = auVar124._4_4_;
        auVar125._8_4_ = auVar124._12_4_;
        auVar125._12_4_ = auVar124._12_4_;
        auVar125 = auVar125 | auVar117 & auVar124;
        lVar81 = auVar150._8_8_;
        if ((~auVar125._0_4_ & 1) != 0) {
          ppsVar78[-2] = local_460 + auVar150._0_8_ + 1;
        }
        if (((auVar125 ^ auVar111) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *ppsVar78 = local_460 + (lVar81 - auVar111._8_8_);
        }
        auVar150._0_8_ = auVar150._0_8_ + auVar126._0_8_;
        auVar150._8_8_ = lVar81 + auVar126._8_8_;
        ppsVar78 = ppsVar78 + 4;
        uVar66 = uVar66 - 2;
      } while (uVar66 != 0);
    }
    local_460[uVar70].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = local_460;
    ptr->active_head = ptr->extra;
    ptr->width = uVar49;
    ptr->height = 0x8000 - iVar80;
    ptr->num_nodes = uVar49;
    ptr->align = (int)((uVar49 - 1) + uVar49) / (int)uVar49;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = uVar49;
    ptr->extra[1].y = 0x40000000;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  local_338 = ptr;
  ImFontAtlasBuildPackCustomRects(atlas_00,ptr);
  local_44c = iVar69;
  if ((char)local_488 != '\0') {
    uVar70 = 0;
    do {
      lVar81 = uVar70 * 0x110;
      iVar69 = *(int *)((long)pvVar57 + lVar81 + 0xe8);
      if (iVar69 != 0) {
        stbrp_pack_rects(local_338,*(stbrp_rect **)((long)pvVar57 + lVar81 + 200),iVar69);
        lVar72 = (long)*(int *)((long)pvVar57 + lVar81 + 0xe8);
        if (0 < lVar72) {
          lVar81 = *(long *)((long)pvVar57 + lVar81 + 200);
          lVar68 = 0;
          do {
            if (*(int *)(lVar81 + 0x14 + lVar68) != 0) {
              iVar69 = *(int *)(lVar81 + 8 + lVar68) + *(int *)(lVar81 + 0x10 + lVar68);
              if (iVar69 < atlas_00->TexHeight) {
                iVar69 = atlas_00->TexHeight;
              }
              atlas_00->TexHeight = iVar69;
            }
            lVar68 = lVar68 + 0x18;
          } while (lVar72 * 0x18 != lVar68);
        }
      }
      uVar70 = uVar70 + 1;
    } while (uVar70 < (uVar86 & 0xffffffff));
  }
  uVar49 = atlas_00->TexHeight;
  if ((atlas_00->Flags & 1) == 0) {
    uVar49 = (int)(uVar49 - 1) >> 1 | uVar49 - 1;
    uVar49 = (int)uVar49 >> 2 | uVar49;
    uVar49 = (int)uVar49 >> 4 | uVar49;
    uVar49 = (int)uVar49 >> 8 | uVar49;
    uVar49 = (int)uVar49 >> 0x10 | uVar49;
  }
  iVar69 = uVar49 + 1;
  atlas_00->TexHeight = iVar69;
  auVar95._0_4_ = (float)atlas_00->TexWidth;
  auVar95._4_4_ = (float)iVar69;
  auVar95._8_8_ = 0;
  auVar105 = divps(_DAT_001e93c0,auVar95);
  atlas_00->TexUvScale = auVar105._0_8_;
  puVar56 = (uchar *)ImGui::MemAlloc((long)(iVar69 * atlas_00->TexWidth));
  atlas_00->TexPixelsAlpha8 = puVar56;
  memset(puVar56,0,(long)atlas_00->TexHeight * (long)atlas_00->TexWidth);
  if ((char)local_488 != '\0') {
    local_390 = atlas_00->TexPixelsAlpha8;
    lVar81 = (long)local_44c;
    local_278 = iVar80;
    iStack_274 = iVar80;
    iStack_270 = iVar80;
    iStack_26c = iVar80;
    lVar72 = 0;
    auVar105 = _DAT_001e93b0;
    local_490 = lVar81;
    do {
      local_330 = lVar72;
      if (*(int *)((long)pvStack_400 + lVar72 * 0x110 + 0xe8) != 0) {
        psVar89 = (stbtt_fontinfo *)((long)pvStack_400 + lVar72 * 0x110);
        fVar93 = *(float *)&psVar89[1].userdata;
        if (fVar93 <= 0.0) {
          auVar112._4_4_ = auVar105._4_4_;
          auVar112._0_4_ = (uint)fVar93 ^ auVar105._0_4_;
          auVar112._8_4_ = auVar105._8_4_;
          auVar112._12_4_ = auVar105._12_4_;
          uVar49 = (uint)(ushort)(*(ushort *)(psVar89->data + (long)psVar89->head + 0x12) << 8 |
                                 *(ushort *)(psVar89->data + (long)psVar89->head + 0x12) >> 8);
        }
        else {
          puVar56 = psVar89->data;
          lVar72 = (long)psVar89->hhea;
          uVar49 = ((int)(short)((ushort)puVar56[lVar72 + 4] << 8) | (uint)puVar56[lVar72 + 5]) -
                   ((int)(short)((ushort)puVar56[lVar72 + 6] << 8) | (uint)puVar56[lVar72 + 7]);
          auVar112 = ZEXT416((uint)fVar93);
        }
        local_2f8._4_12_ = auVar112._4_12_;
        local_2f8._0_4_ = auVar112._0_4_ / (float)(int)uVar49;
        local_2e0 = (atlas_00->ConfigData).Data;
        if (0 < psVar89[1].fontstart) {
          lVar72._0_4_ = psVar89[1].hmtx;
          lVar72._4_4_ = psVar89[1].kern;
          uVar86._0_4_ = psVar89[1].glyf;
          uVar86._4_4_ = psVar89[1].hhea;
          auVar31._8_6_ = 0;
          auVar31._0_8_ = uVar86;
          auVar31[0xe] = (char)((uint)uVar86._4_4_ >> 0x18);
          auVar33._8_4_ = 0;
          auVar33._0_8_ = uVar86;
          auVar33[0xc] = (char)((uint)uVar86._4_4_ >> 0x10);
          auVar33._13_2_ = auVar31._13_2_;
          auVar34._8_4_ = 0;
          auVar34._0_8_ = uVar86;
          auVar34._12_3_ = auVar33._12_3_;
          auVar35._8_2_ = 0;
          auVar35._0_8_ = uVar86;
          auVar35[10] = (char)((uint)uVar86._4_4_ >> 8);
          auVar35._11_4_ = auVar34._11_4_;
          auVar36._8_2_ = 0;
          auVar36._0_8_ = uVar86;
          auVar36._10_5_ = auVar35._10_5_;
          auVar37[8] = (char)uVar86._4_4_;
          auVar37._0_8_ = uVar86;
          auVar37._9_6_ = auVar36._9_6_;
          cVar103 = (char)((uint)(undefined4)uVar86 >> 0x18);
          Var25 = CONCAT91((unkuint9)auVar37._8_7_ << 8,cVar103);
          auVar30[10] = 0;
          auVar30._0_10_ = Var25;
          cVar102 = (char)((uint)(undefined4)uVar86 >> 0x10);
          auVar97[4] = cVar102;
          auVar97._0_4_ = (undefined4)uVar86;
          auVar97._5_11_ = auVar30 << 8;
          auVar29[0xc] = 0;
          auVar29._0_12_ = auVar97._4_12_;
          cVar101 = (char)((uint)(undefined4)uVar86 >> 8);
          auVar24._1_13_ = auVar29 << 8;
          auVar24[0] = cVar101;
          bVar92 = (byte)(undefined4)uVar86;
          auVar96._0_2_ = CONCAT11(0,bVar92);
          auVar96._2_14_ = auVar24;
          uVar40 = auVar24._0_2_;
          sVar23 = -auVar97._4_2_;
          uVar104 = (ushort)Var25;
          sVar134 = -uVar104;
          local_3e8 = (ulong)uVar40;
          auVar32._10_2_ = 0;
          auVar32._0_10_ = auVar96._0_10_;
          auVar32._12_2_ = uVar104;
          uVar38 = CONCAT42(auVar32._10_4_,auVar97._4_2_);
          auVar98._4_2_ = uVar40;
          auVar98._0_4_ = auVar96._0_4_;
          auVar98._6_10_ = (unkuint10)uVar38 << 0x10;
          auVar99._0_4_ = (float)auVar96._0_2_;
          auVar99._4_4_ = (float)auVar98._4_4_;
          auVar99._8_4_ = (float)(int)uVar38;
          auVar99._12_4_ = (float)uVar104;
          local_268 = divps(_DAT_001e93c0,auVar99);
          auVar118[0] = -(bVar92 == 0);
          auVar118[1] = -(bVar92 == 0);
          auVar118[2] = -(bVar92 == 0);
          auVar118[3] = -(bVar92 == 0);
          auVar118[4] = -(cVar101 == '\0');
          auVar118[5] = -(cVar101 == '\0');
          auVar118[6] = -(cVar101 == '\0');
          auVar118[7] = -(cVar101 == '\0');
          auVar118[8] = -(cVar102 == '\0');
          auVar118[9] = -(cVar102 == '\0');
          auVar118[10] = -(cVar102 == '\0');
          auVar118[0xb] = -(cVar102 == '\0');
          auVar118[0xc] = -(cVar103 == '\0');
          auVar118[0xd] = -(cVar103 == '\0');
          auVar118[0xe] = -(cVar103 == '\0');
          auVar118[0xf] = -(cVar103 == '\0');
          Var28 = CONCAT64(CONCAT42(CONCAT22(sVar134,sVar134),sVar23),CONCAT22(sVar23,sVar134));
          auVar26._4_8_ = (long)((unkuint10)Var28 >> 0x10);
          auVar26._2_2_ = 1 - uVar40;
          auVar26._0_2_ = 1 - uVar40;
          auVar106._0_4_ = (float)(int)(short)(1 - auVar96._0_2_);
          auVar106._4_4_ = (float)(auVar26._0_4_ >> 0x10);
          auVar106._8_4_ = (float)((int)((unkuint10)Var28 >> 0x10) >> 0x10);
          auVar106._12_4_ = (float)(int)sVar134;
          auVar113._0_4_ = (float)local_2f8._0_4_ * auVar99._0_4_;
          auVar113._4_4_ = (float)local_2f8._0_4_ * auVar99._4_4_;
          auVar113._8_4_ = (float)local_2f8._0_4_ * auVar99._8_4_;
          auVar113._12_4_ = (float)local_2f8._0_4_ * auVar99._12_4_;
          auVar100._0_4_ = auVar99._0_4_ + auVar99._0_4_;
          auVar100._4_4_ = auVar99._4_4_ + auVar99._4_4_;
          auVar100._8_4_ = auVar99._8_4_ + auVar99._8_4_;
          auVar100._12_4_ = auVar99._12_4_ + auVar99._12_4_;
          auVar105 = divps(auVar106,auVar100);
          local_258 = ~auVar118 & auVar105;
          fVar93 = auVar113._4_4_;
          if (auVar113._0_4_ <= auVar113._4_4_) {
            fVar93 = auVar113._0_4_;
          }
          local_3dc = (0.35 / fVar93) * (0.35 / fVar93);
          local_298 = auVar113._4_4_;
          fStack_294 = auVar113._4_4_;
          fStack_290 = auVar113._4_4_;
          fStack_28c = auVar113._4_4_;
          uVar49 = (uint)auVar113._4_4_ ^ (uint)DAT_001e93b0;
          local_308 = (ulong)((undefined4)uVar86 & 0xff);
          local_300 = (ulong)((uint)(undefined4)uVar86 >> 8 & 0xff);
          local_288 = auVar113;
          local_248._4_4_ = uVar49;
          local_248._0_4_ = auVar113._0_4_;
          fStack_240 = auVar113._0_4_;
          fStack_23c = (float)uVar49;
          uVar49 = 0xffffffff;
          lVar68 = 0;
          local_378 = lVar72;
          local_310 = (ulong)(auVar96._0_4_ & 0xff);
          local_370 = psVar89;
          auVar105 = _DAT_001e93b0;
          do {
            fVar93 = auVar113._0_4_;
            if (*(int *)(lVar72 + 0x14 + lVar68 * 0x18) != 0) {
              local_3c0 = lVar72 + lVar68 * 0x18;
              uVar138 = *(undefined8 *)(local_3c0 + 4);
              iVar69 = (int)uVar138;
              iVar80 = (int)((ulong)uVar138 >> 0x20);
              if (iVar69 == 0) {
                if ((iVar80 == 0) && (-1 < (int)uVar49)) {
                  lVar58 = *(long *)&psVar89[1].loca;
                  puVar1 = (undefined4 *)(lVar58 + (ulong)uVar49 * 0x1c);
                  uVar136 = *puVar1;
                  uVar161 = puVar1[1];
                  uVar178 = puVar1[2];
                  uVar179 = puVar1[3];
                  *(undefined1 (*) [16])(lVar58 + 0xc + lVar68 * 0x1c) =
                       *(undefined1 (*) [16])(lVar58 + 0xc + (ulong)uVar49 * 0x1c);
                  puVar1 = (undefined4 *)(lVar58 + lVar68 * 0x1c);
                  *puVar1 = uVar136;
                  puVar1[1] = uVar161;
                  puVar1[2] = uVar178;
                  puVar1[3] = uVar179;
                }
              }
              else if (iVar80 != 0) {
                local_2b0 = (short *)(lVar68 * 0x1c + *(long *)&psVar89[1].loca);
                info = (stbtt_fontinfo *)psVar89->data;
                local_368 = lVar68;
                local_34c = uVar49;
                uVar49 = stbtt_FindGlyphIndex(info,psVar89->index_map);
                lVar72 = local_3c0;
                uVar138 = *(undefined8 *)(local_3c0 + 0xc);
                fVar109 = (float)(iVar69 - local_278);
                *(float *)(local_3c0 + 4) = fVar109;
                *(int *)(local_3c0 + 8) = iVar80 - iStack_274;
                *(int *)(local_3c0 + 0xc) = (int)uVar138 + iStack_270;
                *(int *)(local_3c0 + 0x10) = (int)((ulong)uVar138 >> 0x20) + iStack_26c;
                uVar40 = *(ushort *)((long)&info->glyf + (long)psVar89->hhea + 2);
                uVar40 = uVar40 << 8 | uVar40 >> 8;
                iVar69 = psVar89->hmtx;
                pbVar79 = (byte *)((long)info + (ulong)uVar40 * 4 + (long)iVar69 + -4);
                pbVar88 = (byte *)((long)info + (ulong)uVar40 * 4 + (long)iVar69 + -3);
                if ((int)uVar49 < (int)(uint)uVar40) {
                  pbVar79 = (byte *)((long)&info->userdata + (long)(int)(uVar49 * 4) + (long)iVar69)
                  ;
                  pbVar88 = (byte *)((long)&info->userdata +
                                    (long)(int)(uVar49 * 4) + 1 + (long)iVar69);
                }
                local_354 = (uint)*pbVar88;
                local_350 = (uint)*pbVar79;
                stbtt_GetGlyphBitmapBoxSubpixel
                          (psVar89,uVar49,(float)local_288._0_4_,local_298,fVar109,fVar93,&local_340
                           ,&local_344,&local_29c,&local_2a0);
                iVar69 = *(int *)(lVar72 + 0xc);
                iVar80 = *(int *)(lVar72 + 0x10);
                local_410 = (ulong)*(uint *)(lVar72 + 4);
                local_3f8 = (ulong)*(uint *)(lVar72 + 8);
                local_318 = (ulong)uVar49;
                uVar49 = stbtt_GetGlyphShape(psVar89,uVar49,(stbtt_vertex **)&local_440);
                uVar86 = local_310;
                iVar50 = (int)local_310;
                uVar87 = -iVar50;
                local_2b8 = (ulong)uVar87;
                uVar87 = (int)local_410 + uVar87 + 1;
                local_320 = (ulong)(uint)-(int)local_3e8;
                stbtt_GetGlyphBitmapBoxSubpixel
                          (local_370,(int)local_318,(float)local_288._0_4_,local_298,fVar109,fVar93,
                           (int *)&local_49c,&local_33c,(int *)0x0,(int *)0x0);
                sVar48 = local_49c;
                if (uVar87 != 0) {
                  iVar71 = (int)local_320 + (int)local_3f8 + 1;
                  if ((iVar71 != 0) && (0 < (int)uVar49)) {
                    local_2c0 = local_390 + iVar80 * lVar81 + (long)iVar69;
                    local_410 = (ulong)(uint)((int)local_410 - iVar50);
                    local_3f8 = (ulong)(uint)((int)local_3f8 - (int)local_3e8);
                    lVar72 = CONCAT44(local_440._4_4_,(stbtt_uint32)local_440);
                    local_434 = local_33c;
                    lVar68 = 0;
                    uVar52 = 0;
                    do {
                      uVar52 = uVar52 + (*(char *)(lVar72 + 0xc + lVar68) == '\x01');
                      lVar68 = lVar68 + 0xe;
                    } while ((ulong)uVar49 * 0xe != lVar68);
                    if (uVar52 != 0) {
                      uVar136 = 0;
                      local_448 = ImGui::MemAlloc((ulong)uVar52 * 4);
                      if (local_448 != (void *)0x0) {
                        bVar91 = false;
                        iVar80 = 0;
                        uVar161 = 0;
                        uVar178 = 0;
                        iVar69 = 0;
                        bVar90 = true;
                        do {
                          bVar84 = bVar90;
                          if (bVar91) {
                            pvVar57 = ImGui::MemAlloc((long)iVar69 << 3);
                            uVar161 = SUB84(pvVar57,0);
                            uVar178 = (undefined4)((ulong)pvVar57 >> 0x20);
                            if (pvVar57 == (void *)0x0) {
                              ImGui::MemFree((void *)0x0);
                              ImGui::MemFree(local_448);
                              goto LAB_001a57c1;
                            }
                          }
                          local_238[0].data =
                               (uchar *)((ulong)local_238[0].data & 0xffffffff00000000);
                          fVar93 = 0.0;
                          fVar109 = 0.0;
                          uVar85 = 0xffffffff;
                          lVar68 = 0;
                          do {
                            iVar69 = (int)local_238[0].data;
                            switch(*(undefined1 *)(lVar72 + 0xc + lVar68)) {
                            case 1:
                              if (-1 < (int)uVar85) {
                                *(int *)((long)local_448 + (ulong)uVar85 * 4) =
                                     (int)local_238[0].data - iVar80;
                              }
                              uVar85 = uVar85 + 1;
                              auVar105 = pshuflw(ZEXT416(*(uint *)(lVar72 + lVar68)),
                                                 ZEXT416(*(uint *)(lVar72 + lVar68)),0x60);
                              fVar93 = (float)(auVar105._0_4_ >> 0x10);
                              fVar109 = (float)(auVar105._4_4_ >> 0x10);
                              local_238[0].data =
                                   (uchar *)CONCAT44(local_238[0].data._4_4_,
                                                     (int)local_238[0].data + 1);
                              iVar80 = iVar69;
                              if (CONCAT44(uVar178,uVar161) != 0) {
                                pfVar2 = (float *)(CONCAT44(uVar178,uVar161) + (long)iVar69 * 8);
                                *pfVar2 = fVar93;
                                pfVar2[1] = fVar109;
                              }
                              break;
                            case 2:
                              lVar58 = (long)(int)local_238[0].data;
                              auVar105 = pshuflw(ZEXT416(*(uint *)(lVar72 + lVar68)),
                                                 ZEXT416(*(uint *)(lVar72 + lVar68)),0x60);
                              fVar93 = (float)(auVar105._0_4_ >> 0x10);
                              fVar109 = (float)(auVar105._4_4_ >> 0x10);
                              local_238[0].data =
                                   (uchar *)CONCAT44(local_238[0].data._4_4_,
                                                     (int)local_238[0].data + 1);
                              if (CONCAT44(uVar178,uVar161) != 0) {
                                pfVar2 = (float *)(CONCAT44(uVar178,uVar161) + lVar58 * 8);
                                *pfVar2 = fVar93;
                                pfVar2[1] = fVar109;
                              }
                              break;
                            case 3:
                              stbtt__tesselate_curve
                                        ((stbtt__point *)CONCAT44(uVar178,uVar161),(int *)local_238,
                                         fVar93,fVar109,(float)(int)*(short *)(lVar72 + 4 + lVar68),
                                         (float)(int)*(short *)(lVar72 + 6 + lVar68),
                                         (float)(int)*(short *)(lVar72 + lVar68),
                                         (float)(int)*(short *)(lVar72 + 2 + lVar68),local_3dc,0);
                              goto LAB_001a4aeb;
                            case 4:
                              stbtt__tesselate_cubic
                                        ((stbtt__point *)CONCAT44(uVar178,uVar161),(int *)local_238,
                                         fVar93,fVar109,(float)(int)*(short *)(lVar72 + 4 + lVar68),
                                         (float)(int)*(short *)(lVar72 + 6 + lVar68),
                                         (float)(int)*(short *)(lVar72 + 8 + lVar68),
                                         (float)(int)*(short *)(lVar72 + 10 + lVar68),
                                         (float)(int)*(short *)(lVar72 + lVar68),
                                         (float)(int)*(short *)(lVar72 + 2 + lVar68),local_3dc,0);
LAB_001a4aeb:
                              auVar105 = pshuflw(ZEXT416(*(uint *)(lVar72 + lVar68)),
                                                 ZEXT416(*(uint *)(lVar72 + lVar68)),0x60);
                              fVar93 = (float)(auVar105._0_4_ >> 0x10);
                              fVar109 = (float)(auVar105._4_4_ >> 0x10);
                            }
                            uVar86 = local_310;
                            lVar68 = lVar68 + 0xe;
                          } while ((ulong)uVar49 * 0xe != lVar68);
                          *(int *)((long)local_448 + (long)(int)uVar85 * 4) =
                               (int)local_238[0].data - iVar80;
                          bVar91 = true;
                          iVar69 = (int)local_238[0].data;
                          bVar90 = false;
                        } while (bVar84);
                        pvVar57 = (void *)CONCAT44(uVar178,uVar161);
                        if (pvVar57 != (void *)0x0) {
                          lVar72 = 0;
                          lVar68 = 0;
                          do {
                            lVar68 = (long)(int)lVar68 +
                                     (long)*(int *)((long)local_448 + lVar72 * 4);
                            lVar72 = lVar72 + 1;
                          } while (CONCAT44(uVar136,uVar52) != lVar72);
                          local_458 = (stbtt__edge *)ImGui::MemAlloc(lVar68 * 0x14 + 0x14);
                          pvVar53 = pvVar57;
                          if (local_458 != (stbtt__edge *)0x0) {
                            lVar72 = 0;
                            uVar49 = 0;
                            iVar69 = 0;
                            do {
                              iVar80 = *(int *)((long)local_448 + lVar72 * 4);
                              if (0 < iVar80) {
                                lVar68 = (long)iVar69;
                                uVar66 = (ulong)(iVar80 - 1);
                                uVar70 = 0;
                                iVar50 = iVar80;
                                do {
                                  iVar51 = (int)uVar66;
                                  fVar93 = *(float *)((long)pvVar53 +
                                                     (long)iVar51 * 8 + lVar68 * 8 + 4);
                                  fVar109 = *(float *)((long)pvVar57 + uVar70 * 8 + lVar68 * 8 + 4);
                                  if ((fVar93 != fVar109) || (NAN(fVar93) || NAN(fVar109))) {
                                    iVar65 = (int)uVar70;
                                    iVar50 = iVar51;
                                    if (fVar93 <= fVar109) {
                                      iVar50 = iVar65;
                                      iVar65 = iVar51;
                                    }
                                    local_458[(int)uVar49].invert = (uint)(fVar109 < fVar93);
                                    uVar138 = *(undefined8 *)
                                               ((long)pvVar53 + (long)iVar50 * 8 + lVar68 * 8);
                                    uVar163 = *(undefined8 *)
                                               ((long)pvVar53 + (long)iVar65 * 8 + lVar68 * 8);
                                    psVar74 = local_458 + (int)uVar49;
                                    psVar74->x0 = (float)uVar138 * (float)local_248._0_4_ + 0.0;
                                    psVar74->y0 = (float)((ulong)uVar138 >> 0x20) *
                                                  (float)local_248._4_4_ + 0.0;
                                    psVar74->x1 = (float)uVar163 * fStack_240 + 0.0;
                                    psVar74->y1 = (float)((ulong)uVar163 >> 0x20) * fStack_23c + 0.0
                                    ;
                                    uVar49 = uVar49 + 1;
                                    iVar50 = *(int *)((long)local_448 + lVar72 * 4);
                                  }
                                  uVar66 = uVar70 & 0xffffffff;
                                  uVar70 = uVar70 + 1;
                                } while ((long)uVar70 < (long)iVar50);
                              }
                              iVar69 = iVar69 + iVar80;
                              lVar72 = lVar72 + 1;
                              pvVar53 = (void *)CONCAT44(uVar178,uVar161);
                            } while (lVar72 != CONCAT44(uVar136,uVar52));
                            stbtt__sort_edges_quicksort(local_458,uVar49);
                            if (1 < (int)uVar49) {
                              uVar70 = 1;
                              lVar72 = 2;
                              psVar74 = local_458;
                              do {
                                uVar3 = local_458[uVar70].x0;
                                uVar4 = local_458[uVar70].y0;
                                iVar69 = local_458[uVar70].invert;
                                local_238[0].cursor = iVar69;
                                local_238[0].data = *(uchar **)&local_458[uVar70].x1;
                                lVar68 = lVar72;
                                psVar82 = psVar74;
                                do {
                                  if (psVar82->y0 <= (float)uVar4) {
                                    uVar52 = (int)lVar68 - 1;
                                    goto LAB_001a4d40;
                                  }
                                  psVar82[1].invert = psVar82->invert;
                                  fVar93 = psVar82->y0;
                                  fVar109 = psVar82->x1;
                                  fVar108 = psVar82->y1;
                                  psVar82[1].x0 = psVar82->x0;
                                  psVar82[1].y0 = fVar93;
                                  psVar82[1].x1 = fVar109;
                                  psVar82[1].y1 = fVar108;
                                  lVar68 = lVar68 + -1;
                                  psVar82 = psVar82 + -1;
                                } while (1 < lVar68);
                                uVar52 = 0;
LAB_001a4d40:
                                if (uVar70 != uVar52) {
                                  local_458[(int)uVar52].x0 = (float)uVar3;
                                  local_458[(int)uVar52].y0 = (float)uVar4;
                                  *(uchar **)&local_458[(int)uVar52].x1 = local_238[0].data;
                                  local_458[(int)uVar52].invert = iVar69;
                                }
                                uVar70 = uVar70 + 1;
                                lVar72 = lVar72 + 1;
                                psVar74 = psVar74 + 1;
                              } while (uVar70 != uVar49);
                            }
                            local_480._0_8_ = (stbtt__active_edge *)0x0;
                            scanline = local_238;
                            if (0x40 < (int)uVar87) {
                              scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)uVar87 * 8 + 4);
                            }
                            local_458[(int)uVar49].y0 = (float)(iVar71 + local_434) + 1.0;
                            if ((uint)local_3f8 < 0x7fffffff) {
                              local_2d8 = (long)(int)uVar87;
                              local_360 = (float *)((long)&scanline->data + local_2d8 * 4);
                              local_348 = (float)(int)sVar48;
                              local_328 = local_360 + 1;
                              local_2c8 = local_2d8 * 4;
                              local_2d0 = (long)((int)local_410 + 2) << 2;
                              local_42c = (float)(int)uVar87;
                              local_388 = 0;
                              local_380 = 0;
                              local_3c8 = (undefined8 *)0x0;
                              local_430 = 0;
                              local_3f0 = (stbtt__active_edge *)0x0;
                              psVar62 = (stbtt__active_edge *)0x0;
                              psVar74 = local_458;
                              iVar69 = local_434;
                              do {
                                fVar93 = (float)iVar69;
                                fVar109 = fVar93 + 1.0;
                                local_358 = iVar69;
                                memset(scanline,0,local_2c8);
                                memset(local_360,0,local_2d0);
                                if (psVar62 != (stbtt__active_edge *)0x0) {
                                  psVar59 = (stbtt__active_edge *)local_480;
                                  do {
                                    if (psVar62->ey <= fVar93) {
                                      psVar59->next = psVar62->next;
                                      psVar62->direction = 0.0;
                                      psVar62->next = local_3f0;
                                      local_3f0 = psVar62;
                                      psVar62 = psVar59;
                                    }
                                    ppsVar39 = &psVar62->next;
                                    psVar59 = psVar62;
                                    psVar62 = *ppsVar39;
                                  } while (*ppsVar39 != (stbtt__active_edge *)0x0);
                                }
                                fVar108 = psVar74->y0;
                                psVar62 = local_3f0;
                                if (fVar108 <= fVar109) {
                                  bVar90 = local_434 != 0;
                                  bVar91 = (int)local_380 == 0;
                                  do {
                                    fVar121 = psVar74->y1;
                                    if ((fVar108 != fVar121) || (NAN(fVar108) || NAN(fVar121))) {
                                      if (psVar62 == (stbtt__active_edge *)0x0) {
                                        if (local_430 == 0) {
                                          puVar61 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                          if (puVar61 == (undefined8 *)0x0) {
                                            psVar62 = (stbtt__active_edge *)0x0;
                                            local_430 = 0;
                                            goto LAB_001a5721;
                                          }
                                          *puVar61 = local_3c8;
                                          fVar108 = psVar74->y0;
                                          fVar121 = psVar74->y1;
                                          local_3c8 = puVar61;
                                          local_430 = 799;
                                        }
                                        else {
                                          local_430 = local_430 + -1;
                                        }
                                        psVar62 = (stbtt__active_edge *)
                                                  (local_3c8 + (long)local_430 * 4 + 1);
                                        psVar59 = (stbtt__active_edge *)0x0;
                                      }
                                      else {
                                        psVar59 = psVar62->next;
                                      }
                                      fVar122 = psVar74->x0;
                                      fVar123 = (psVar74->x1 - fVar122) / (fVar121 - fVar108);
                                      psVar62->fdx = fVar123;
                                      psVar62->fdy = (float)(-(uint)(fVar123 != 0.0) &
                                                            (uint)(1.0 / fVar123));
                                      psVar62->fx = ((fVar93 - fVar108) * fVar123 + fVar122) -
                                                    local_348;
                                      psVar62->direction =
                                           *(float *)(&DAT_001f6f9c +
                                                     (ulong)(psVar74->invert == 0) * 4);
                                      psVar62->sy = fVar108;
                                      psVar62->ey = fVar121;
                                      psVar62->next = (stbtt__active_edge *)0x0;
                                      if (fVar121 < fVar93 && (bVar91 && bVar90)) {
                                        psVar62->ey = fVar93;
                                      }
                                      psVar62->next = (stbtt__active_edge *)local_480._0_8_;
                                      local_480._0_8_ = psVar62;
                                      psVar62 = psVar59;
                                    }
LAB_001a5721:
                                    fVar108 = psVar74[1].y0;
                                    psVar74 = psVar74 + 1;
                                  } while (fVar108 <= fVar109);
                                }
                                local_3f0 = psVar62;
                                if ((stbtt__active_edge *)local_480._0_8_ !=
                                    (stbtt__active_edge *)0x0) {
                                  local_2a8 = psVar74;
                                  psVar62 = (stbtt__active_edge *)local_480._0_8_;
                                  do {
                                    fVar108 = psVar62->fx;
                                    fVar121 = psVar62->fdx;
                                    if ((fVar121 != 0.0) || (NAN(fVar121))) {
                                      fVar129 = fVar121 + fVar108;
                                      fVar122 = psVar62->sy;
                                      fVar123 = (float)(~-(uint)(fVar93 < fVar122) & (uint)fVar108 |
                                                       (uint)((fVar122 - fVar93) * fVar121 + fVar108
                                                             ) & -(uint)(fVar93 < fVar122));
                                      if (0.0 <= fVar123) {
                                        fVar131 = psVar62->ey;
                                        fVar133 = (float)(-(uint)(fVar131 < fVar109) &
                                                          (uint)((fVar131 - fVar93) * fVar121 +
                                                                fVar108) |
                                                         ~-(uint)(fVar131 < fVar109) & (uint)fVar129
                                                         );
                                        if (((0.0 <= fVar133) && (fVar123 < local_42c)) &&
                                           (fVar133 < local_42c)) {
                                          if (fVar122 <= fVar93) {
                                            fVar122 = fVar93;
                                          }
                                          uVar49 = (uint)fVar123;
                                          if (fVar109 <= fVar131) {
                                            fVar131 = fVar109;
                                          }
                                          uVar52 = (uint)fVar133;
                                          if (uVar49 == uVar52) {
                                            fVar146 = (fVar131 - fVar122) * psVar62->direction;
                                            lVar72 = (long)(int)uVar49;
                                            *(float *)((long)&scanline->data + lVar72 * 4) =
                                                 ((((float)(int)uVar49 + 1.0) - fVar133) +
                                                 (((float)(int)uVar49 + 1.0) - fVar123)) * 0.5 *
                                                 fVar146 + *(float *)((long)&scanline->data +
                                                                     lVar72 * 4);
                                          }
                                          else {
                                            fVar121 = psVar62->fdy;
                                            uVar85 = uVar49;
                                            fVar135 = fVar133;
                                            if (fVar133 < fVar123) {
                                              fVar108 = fVar93 - fVar122;
                                              fVar122 = (fVar93 - fVar131) + fVar109;
                                              fVar121 = -fVar121;
                                              fVar131 = fVar108 + fVar109;
                                              uVar85 = uVar52;
                                              uVar52 = uVar49;
                                              fVar108 = fVar129;
                                              fVar135 = fVar123;
                                              fVar123 = fVar133;
                                            }
                                            iVar69 = uVar85 + 1;
                                            fVar144 = (float)(int)uVar52;
                                            fVar133 = ((float)iVar69 - fVar108) * fVar121 + fVar93;
                                            fVar129 = fVar109;
                                            if (fVar133 <= fVar109) {
                                              fVar129 = fVar133;
                                            }
                                            fVar146 = psVar62->direction;
                                            fVar133 = (fVar129 - fVar122) * fVar146;
                                            fVar108 = (fVar144 - fVar108) * fVar121 + fVar93;
                                            *(float *)((long)&scanline->data + (long)(int)uVar85 * 4
                                                      ) = ((float)iVar69 - fVar123) * fVar133 * 0.5
                                                          + *(float *)((long)&scanline->data +
                                                                      (long)(int)uVar85 * 4);
                                            if ((fVar109 < fVar108) &&
                                               (fVar108 = fVar109, uVar52 - iVar69 != 0)) {
                                              fVar121 = (fVar109 - fVar129) /
                                                        (float)(int)(uVar52 - iVar69);
                                            }
                                            if (iVar69 < (int)uVar52) {
                                              lVar72 = 0;
                                              do {
                                                *(float *)((long)&scanline->data +
                                                          (iVar69 + lVar72) * 4) =
                                                     fVar121 * fVar146 * 0.5 + fVar133 +
                                                     *(float *)((long)&scanline->data +
                                                               (iVar69 + lVar72) * 4);
                                                fVar133 = fVar133 + fVar121 * fVar146;
                                                lVar72 = lVar72 + 1;
                                              } while (~uVar85 + uVar52 != (int)lVar72);
                                            }
                                            lVar72 = (long)(int)uVar52;
                                            *(float *)((long)&scanline->data + lVar72 * 4) =
                                                 (((fVar144 + 1.0) - fVar135) +
                                                 ((fVar144 + 1.0) - fVar144)) * 0.5 *
                                                 (fVar131 - fVar108) * fVar146 + fVar133 +
                                                 *(float *)((long)&scanline->data + lVar72 * 4);
                                            fVar146 = (fVar131 - fVar122) * fVar146;
                                          }
                                          local_328[lVar72] = fVar146 + local_328[lVar72];
                                          goto LAB_001a54d0;
                                        }
                                      }
                                      if ((uint)local_410 < 0x7fffffff) {
                                        local_3b8 = (ImFontConfig *)(ulong)(uint)fVar108;
                                        uStack_3b0 = 0;
                                        uStack_3ac = 0;
                                        local_488 = CONCAT44(local_488._4_4_,fVar121);
                                        local_480._8_16_ = ZEXT416((uint)fVar129);
                                        uVar49 = 0;
                                        do {
                                          fVar129 = (float)(int)uVar49;
                                          uVar52 = uVar49 + 1;
                                          fVar123 = (float)(int)uVar52;
                                          fVar122 = (fVar129 - fVar108) / fVar121 + fVar93;
                                          fVar121 = (fVar123 - fVar108) / fVar121 + fVar93;
                                          fVar131 = local_480._8_4_;
                                          if ((fVar129 <= fVar108) || (fVar131 <= fVar123)) {
                                            if ((fVar129 <= fVar131) || (fVar108 <= fVar123)) {
                                              fVar133 = fVar93;
                                              if (((fVar129 <= fVar108) || (fVar131 <= fVar129)) &&
                                                 ((fVar129 <= fVar131 || (fVar108 <= fVar129)))) {
                                                fVar122 = fVar93;
                                                if (((fVar108 < fVar123) && (fVar123 < fVar131)) ||
                                                   ((fVar131 < fVar123 && (fVar123 < fVar108))))
                                                goto LAB_001a518a;
                                                goto LAB_001a5238;
                                              }
                                            }
                                            else {
                                              stbtt__handle_clipped_edge
                                                        ((float *)scanline,uVar49,psVar62,fVar108,
                                                         fVar93,fVar123,fVar121);
                                              fVar108 = fVar123;
                                              fVar133 = fVar121;
                                            }
                                            stbtt__handle_clipped_edge
                                                      ((float *)scanline,uVar49,psVar62,fVar108,
                                                       fVar133,fVar129,fVar122);
                                            fVar108 = fVar129;
                                          }
                                          else {
                                            stbtt__handle_clipped_edge
                                                      ((float *)scanline,uVar49,psVar62,fVar108,
                                                       fVar93,fVar129,fVar122);
                                            fVar108 = fVar129;
LAB_001a518a:
                                            stbtt__handle_clipped_edge
                                                      ((float *)scanline,uVar49,psVar62,fVar108,
                                                       fVar122,fVar123,fVar121);
                                            fVar108 = fVar123;
                                            fVar122 = fVar121;
                                          }
LAB_001a5238:
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,uVar49,psVar62,fVar108,
                                                     fVar122,local_480._8_4_,fVar109);
                                          fVar108 = local_3b8._0_4_;
                                          fVar121 = (float)local_488;
                                          uVar49 = uVar52;
                                        } while (uVar87 != uVar52);
                                      }
                                    }
                                    else if (fVar108 < local_42c) {
                                      if (0.0 <= fVar108) {
                                        local_3b8 = (ImFontConfig *)(ulong)(uint)fVar108;
                                        uStack_3b0 = 0;
                                        uStack_3ac = 0;
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,(int)fVar108,psVar62,fVar108,
                                                   fVar93,fVar108,fVar109);
                                        iVar69 = (int)fVar108 + 1;
                                        fVar108 = local_3b8._0_4_;
                                      }
                                      else {
                                        iVar69 = 0;
                                      }
                                      stbtt__handle_clipped_edge
                                                (local_360,iVar69,psVar62,fVar108,fVar93,fVar108,
                                                 fVar109);
                                    }
LAB_001a54d0:
                                    psVar62 = psVar62->next;
                                    psVar74 = local_2a8;
                                  } while (psVar62 != (stbtt__active_edge *)0x0);
                                }
                                psVar62 = (stbtt__active_edge *)local_480._0_8_;
                                if ((uint)local_410 < 0x7fffffff) {
                                  fVar93 = 0.0;
                                  psVar60 = scanline;
                                  uVar70 = local_388;
                                  lVar72 = local_2d8;
                                  do {
                                    fVar93 = fVar93 + *(float *)((long)&psVar60->data +
                                                                local_2d8 * 4);
                                    iVar69 = (int)(ABS(*(float *)&psVar60->data + fVar93) * 255.0 +
                                                  0.5);
                                    if (0xfe < iVar69) {
                                      iVar69 = 0xff;
                                    }
                                    local_2c0[(int)uVar70] = (uchar)iVar69;
                                    uVar70 = (ulong)((int)uVar70 + 1);
                                    psVar60 = (stbtt__buf *)((long)&psVar60->data + 4);
                                    lVar72 = lVar72 + -1;
                                  } while (lVar72 != 0);
                                }
                                for (; psVar62 != (stbtt__active_edge *)0x0; psVar62 = psVar62->next
                                    ) {
                                  psVar62->fx = psVar62->fdx + psVar62->fx;
                                }
                                iVar69 = local_358 + 1;
                                iVar80 = (int)local_380;
                                local_380 = (ulong)(iVar80 + 1);
                                local_388 = (ulong)(uint)((int)local_388 + local_44c);
                                psVar62 = (stbtt__active_edge *)local_480._0_8_;
                              } while (iVar80 != (uint)local_3f8);
                              pvVar53 = (void *)CONCAT44(uVar178,uVar161);
                              puVar61 = local_3c8;
                              while (puVar61 != (undefined8 *)0x0) {
                                puVar9 = (undefined8 *)*puVar61;
                                ImGui::MemFree(puVar61);
                                puVar61 = puVar9;
                              }
                            }
                            if (scanline != local_238) {
                              ImGui::MemFree(scanline);
                            }
                            ImGui::MemFree(local_458);
                          }
                          ImGui::MemFree(local_448);
                          ImGui::MemFree(pvVar53);
                        }
                      }
                    }
                  }
                }
LAB_001a57c1:
                ImGui::MemFree((void *)CONCAT44(local_440._4_4_,(stbtt_uint32)local_440));
                iVar69 = *(int *)(local_3c0 + 0xc);
                iVar80 = *(int *)(local_3c0 + 0x10);
                iVar50 = *(int *)(local_3c0 + 4);
                iVar71 = *(int *)(local_3c0 + 8);
                if ((1 < (byte)local_308) && (local_238[0].data = (uchar *)0x0, 0 < iVar71)) {
                  puVar56 = local_390 + (long)(iVar80 * local_44c) + (long)iVar69;
                  iVar69 = iVar50 - (int)uVar86;
                  uVar49 = iVar50 + (int)local_2b8 + 1;
                  uVar70 = (ulong)uVar49;
                  iVar80 = 0;
                  do {
                    uVar66 = local_308;
                    memset(local_238,0,local_308);
                    uVar87 = uVar49;
                    switch((int)uVar66) {
                    case 2:
                      if (iVar69 < 0) {
LAB_001a5a4f:
                        uVar66 = 0;
                        uVar87 = 0;
                      }
                      else {
                        uVar76 = 0;
                        uVar66 = 0;
                        do {
                          bVar92 = puVar56[uVar76];
                          bVar5 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar76 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar76 + 2 & 7)) =
                               bVar92;
                          uVar52 = (int)uVar66 + ((uint)bVar92 - (uint)bVar5);
                          uVar66 = (ulong)uVar52;
                          puVar56[uVar76] = (uchar)(uVar52 >> 1);
                          uVar76 = uVar76 + 1;
                        } while (uVar70 != uVar76);
                      }
                      break;
                    case 3:
                      if (iVar69 < 0) goto LAB_001a5a4f;
                      uVar76 = 0;
                      uVar66 = 0;
                      do {
                        bVar92 = puVar56[uVar76];
                        bVar5 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar76 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar76 + 3 & 7)) = bVar92
                        ;
                        uVar66 = (ulong)((int)uVar66 + ((uint)bVar92 - (uint)bVar5));
                        puVar56[uVar76] = (uchar)(uVar66 / 3);
                        uVar76 = uVar76 + 1;
                      } while (uVar70 != uVar76);
                      break;
                    case 4:
                      if (iVar69 < 0) goto LAB_001a5a4f;
                      uVar76 = 0;
                      uVar66 = 0;
                      do {
                        bVar92 = puVar56[uVar76];
                        uVar75 = (ulong)((uint)uVar76 & 7);
                        bVar5 = *(byte *)((long)&local_238[0].data + uVar75);
                        *(byte *)((long)&local_238[0].data + (uVar75 ^ 4)) = bVar92;
                        uVar52 = (int)uVar66 + ((uint)bVar92 - (uint)bVar5);
                        uVar66 = (ulong)uVar52;
                        puVar56[uVar76] = (uchar)(uVar52 >> 2);
                        uVar76 = uVar76 + 1;
                      } while (uVar70 != uVar76);
                      break;
                    case 5:
                      if (iVar69 < 0) goto LAB_001a5a4f;
                      uVar76 = 0;
                      uVar66 = 0;
                      do {
                        bVar92 = puVar56[uVar76];
                        bVar5 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar76 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar76 + 5 & 7)) = bVar92
                        ;
                        uVar66 = (ulong)((int)uVar66 + ((uint)bVar92 - (uint)bVar5));
                        puVar56[uVar76] = (uchar)(uVar66 / 5);
                        uVar76 = uVar76 + 1;
                      } while (uVar70 != uVar76);
                      break;
                    default:
                      if (iVar69 < 0) {
                        uVar66 = 0;
                        uVar87 = 0;
                      }
                      else {
                        uVar76 = 0;
                        uVar66 = 0;
                        do {
                          bVar92 = puVar56[uVar76];
                          bVar5 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar76 & 7));
                          *(byte *)((long)&local_238[0].data +
                                   (ulong)((uint)uVar76 + (int)uVar86 & 7)) = bVar92;
                          uVar66 = (ulong)((int)uVar66 + ((uint)bVar92 - (uint)bVar5));
                          puVar56[uVar76] = (uchar)(uVar66 / (uVar86 & 0xffffffff));
                          uVar76 = uVar76 + 1;
                        } while (uVar70 != uVar76);
                      }
                    }
                    if ((int)uVar87 < iVar50) {
                      uVar76 = (ulong)uVar87;
                      do {
                        uVar66 = (ulong)((int)uVar66 -
                                        (uint)*(byte *)((long)&local_238[0].data +
                                                       (ulong)((uint)uVar76 & 7)));
                        puVar56[uVar76] = (uchar)(uVar66 / (uVar86 & 0xffffffff));
                        uVar76 = uVar76 + 1;
                      } while ((int)uVar76 < iVar50);
                    }
                    puVar56 = puVar56 + local_490;
                    iVar80 = iVar80 + 1;
                  } while (iVar80 != iVar71);
                  iVar69 = *(int *)(local_3c0 + 0xc);
                  iVar80 = *(int *)(local_3c0 + 0x10);
                  iVar50 = *(int *)(local_3c0 + 4);
                  iVar71 = *(int *)(local_3c0 + 8);
                  lVar81 = local_490;
                }
                if ((1 < (byte)local_300) && (local_238[0].data = (uchar *)0x0, 0 < iVar50)) {
                  pbVar88 = local_390 + (long)(iVar80 * local_44c) + (long)iVar69;
                  iVar69 = iVar71 - (int)local_3e8;
                  uVar49 = iVar71 + (int)local_320 + 1;
                  uVar86 = (ulong)uVar49;
                  lVar72 = (long)iVar71;
                  iVar80 = 0;
                  do {
                    uVar70 = local_300;
                    memset(local_238,0,local_300);
                    uVar87 = uVar49;
                    switch((int)uVar70) {
                    case 2:
                      if (iVar69 < 0) {
LAB_001a5dba:
                        uVar70 = 0;
                        uVar87 = 0;
                      }
                      else {
                        uVar66 = 0;
                        uVar70 = 0;
                        pbVar79 = pbVar88;
                        do {
                          bVar92 = *pbVar79;
                          bVar5 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar66 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar66 + 2 & 7)) =
                               bVar92;
                          uVar52 = (int)uVar70 + ((uint)bVar92 - (uint)bVar5);
                          uVar70 = (ulong)uVar52;
                          *pbVar79 = (byte)(uVar52 >> 1);
                          uVar66 = uVar66 + 1;
                          pbVar79 = pbVar79 + lVar81;
                        } while (uVar86 != uVar66);
                      }
                      break;
                    case 3:
                      if (iVar69 < 0) goto LAB_001a5dba;
                      uVar66 = 0;
                      uVar70 = 0;
                      pbVar79 = pbVar88;
                      do {
                        bVar92 = *pbVar79;
                        bVar5 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar66 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar66 + 3 & 7)) = bVar92
                        ;
                        uVar70 = (ulong)((int)uVar70 + ((uint)bVar92 - (uint)bVar5));
                        *pbVar79 = (byte)(uVar70 / 3);
                        uVar66 = uVar66 + 1;
                        pbVar79 = pbVar79 + lVar81;
                      } while (uVar86 != uVar66);
                      break;
                    case 4:
                      if (iVar69 < 0) goto LAB_001a5dba;
                      uVar66 = 0;
                      uVar70 = 0;
                      pbVar79 = pbVar88;
                      do {
                        bVar92 = *pbVar79;
                        uVar76 = (ulong)((uint)uVar66 & 7);
                        bVar5 = *(byte *)((long)&local_238[0].data + uVar76);
                        *(byte *)((long)&local_238[0].data + (uVar76 ^ 4)) = bVar92;
                        uVar52 = (int)uVar70 + ((uint)bVar92 - (uint)bVar5);
                        uVar70 = (ulong)uVar52;
                        *pbVar79 = (byte)(uVar52 >> 2);
                        uVar66 = uVar66 + 1;
                        pbVar79 = pbVar79 + lVar81;
                      } while (uVar86 != uVar66);
                      break;
                    case 5:
                      if (iVar69 < 0) goto LAB_001a5dba;
                      uVar66 = 0;
                      uVar70 = 0;
                      pbVar79 = pbVar88;
                      do {
                        bVar92 = *pbVar79;
                        bVar5 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar66 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar66 + 5 & 7)) = bVar92
                        ;
                        uVar70 = (ulong)((int)uVar70 + ((uint)bVar92 - (uint)bVar5));
                        *pbVar79 = (byte)(uVar70 / 5);
                        uVar66 = uVar66 + 1;
                        pbVar79 = pbVar79 + lVar81;
                      } while (uVar86 != uVar66);
                      break;
                    default:
                      if (iVar69 < 0) {
                        uVar70 = 0;
                        uVar87 = 0;
                      }
                      else {
                        uVar66 = 0;
                        uVar70 = 0;
                        pbVar79 = pbVar88;
                        do {
                          bVar92 = *pbVar79;
                          bVar5 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar66 & 7));
                          *(byte *)((long)&local_238[0].data +
                                   (ulong)((int)local_3e8 + (uint)uVar66 & 7)) = bVar92;
                          uVar70 = (ulong)((int)uVar70 + ((uint)bVar92 - (uint)bVar5));
                          *pbVar79 = (byte)(uVar70 / (local_3e8 & 0xffffffff));
                          uVar66 = uVar66 + 1;
                          pbVar79 = pbVar79 + lVar81;
                        } while (uVar86 != uVar66);
                      }
                    }
                    if ((int)uVar87 < iVar71) {
                      lVar68 = (long)(int)uVar87;
                      pbVar79 = pbVar88 + lVar81 * lVar68;
                      do {
                        uVar70 = (ulong)((int)uVar70 -
                                        (uint)*(byte *)((long)&local_238[0].data +
                                                       (ulong)((uint)lVar68 & 7)));
                        *pbVar79 = (byte)(uVar70 / (local_3e8 & 0xffffffff));
                        lVar68 = lVar68 + 1;
                        pbVar79 = pbVar79 + lVar81;
                      } while (lVar72 != lVar68);
                    }
                    pbVar88 = pbVar88 + 1;
                    iVar80 = iVar80 + 1;
                  } while (iVar80 != iVar50);
                  iVar69 = *(int *)(local_3c0 + 0xc);
                  iVar80 = *(int *)(local_3c0 + 0x10);
                  iVar50 = *(int *)(local_3c0 + 4);
                  iVar71 = *(int *)(local_3c0 + 8);
                }
                *local_2b0 = (short)iVar69;
                local_2b0[1] = (short)iVar80;
                local_2b0[2] = (short)iVar50 + (short)iVar69;
                local_2b0[3] = (short)iVar71 + (short)iVar80;
                *(float *)(local_2b0 + 8) =
                     (float)(int)(short)((short)(local_350 << 8) + (short)local_354) *
                     (float)local_2f8._0_4_;
                *(ulong *)(local_2b0 + 4) =
                     CONCAT44((float)local_344 * local_268._4_4_ + local_258._4_4_,
                              (float)local_340 * local_268._0_4_ + local_258._0_4_);
                *(float *)(local_2b0 + 10) =
                     (float)(local_340 + iVar50) * local_268._0_4_ + local_258._0_4_;
                *(float *)(local_2b0 + 0xc) =
                     (float)(local_344 + iVar71) * local_268._4_4_ + local_258._4_4_;
                atlas_00 = local_498;
                lVar72 = local_378;
                lVar68 = local_368;
                psVar89 = local_370;
                auVar105 = _DAT_001e93b0;
                auVar113 = local_258;
                uVar49 = local_34c;
                if ((int)local_318 == 0) {
                  uVar49 = (uint)local_368;
                }
              }
            }
            lVar68 = lVar68 + 1;
          } while (lVar68 < psVar89[1].fontstart);
        }
        fVar93 = local_2e0[local_330].RasterizerMultiply;
        if ((fVar93 != 1.0) || (NAN(fVar93))) {
          lVar72 = 0;
          auVar107 = _DAT_001f6e60;
          auVar110 = _DAT_001f6e50;
          auVar114 = _DAT_001f6e40;
          auVar115 = _DAT_001f6e30;
          do {
            auVar126 = auVar110 & _DAT_001f6e70 | _DAT_001f6e80;
            uVar49 = auVar110._4_4_;
            uVar87 = auVar110._8_4_;
            uVar52 = auVar110._12_4_;
            auVar116 = auVar107 & _DAT_001f6e70 | _DAT_001f6e80;
            uVar85 = auVar107._4_4_;
            uVar130 = auVar107._8_4_;
            uVar132 = auVar107._12_4_;
            auVar150 = auVar115 & _DAT_001f6e70 | _DAT_001f6e80;
            uVar143 = auVar115._4_4_;
            uVar145 = auVar115._8_4_;
            uVar147 = auVar115._12_4_;
            auVar94 = auVar114 & _DAT_001f6e70 | _DAT_001f6e80;
            uVar154 = auVar114._4_4_;
            uVar156 = auVar114._8_4_;
            uVar158 = auVar114._12_4_;
            fVar149 = (((float)(auVar114._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) + auVar94._0_4_
                      ) * fVar93;
            fVar155 = (((float)(uVar154 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar94._4_4_) *
                      fVar93;
            fVar157 = (((float)(uVar156 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar94._8_4_) *
                      fVar93;
            fVar159 = (((float)(uVar158 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar94._12_4_) *
                      fVar93;
            fVar135 = (((float)(auVar115._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                      auVar150._0_4_) * fVar93;
            fVar144 = (((float)(uVar143 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar150._4_4_) *
                      fVar93;
            fVar146 = (((float)(uVar145 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar150._8_4_) *
                      fVar93;
            fVar148 = (((float)(uVar147 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar150._12_4_) *
                      fVar93;
            fVar123 = (((float)(auVar107._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                      auVar116._0_4_) * fVar93;
            fVar129 = (((float)(uVar85 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar116._4_4_) *
                      fVar93;
            fVar131 = (((float)(uVar130 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar116._8_4_) *
                      fVar93;
            fVar133 = (((float)(uVar132 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar116._12_4_) *
                      fVar93;
            fVar109 = (((float)(auVar110._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                      auVar126._0_4_) * fVar93;
            fVar108 = (((float)(uVar49 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar126._4_4_) *
                      fVar93;
            fVar121 = (((float)(uVar87 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar126._8_4_) *
                      fVar93;
            fVar122 = (((float)(uVar52 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar126._12_4_) *
                      fVar93;
            auVar120._0_4_ = (int)fVar109;
            auVar120._4_4_ = (int)fVar108;
            auVar120._8_4_ = (int)fVar121;
            auVar120._12_4_ = (int)fVar122;
            auVar171._0_4_ = auVar120._0_4_ >> 0x1f;
            auVar171._4_4_ = auVar120._4_4_ >> 0x1f;
            auVar171._8_4_ = auVar120._8_4_ >> 0x1f;
            auVar171._12_4_ = auVar120._12_4_ >> 0x1f;
            auVar119._0_4_ = (int)(fVar109 - 2.1474836e+09);
            auVar119._4_4_ = (int)(fVar108 - 2.1474836e+09);
            auVar119._8_4_ = (int)(fVar121 - 2.1474836e+09);
            auVar119._12_4_ = (int)(fVar122 - 2.1474836e+09);
            auVar120 = auVar119 & auVar171 | auVar120;
            auVar128._0_4_ = (int)fVar123;
            auVar128._4_4_ = (int)fVar129;
            auVar128._8_4_ = (int)fVar131;
            auVar128._12_4_ = (int)fVar133;
            auVar172._0_4_ = auVar128._0_4_ >> 0x1f;
            auVar172._4_4_ = auVar128._4_4_ >> 0x1f;
            auVar172._8_4_ = auVar128._8_4_ >> 0x1f;
            auVar172._12_4_ = auVar128._12_4_ >> 0x1f;
            auVar127._0_4_ = (int)(fVar123 - 2.1474836e+09);
            auVar127._4_4_ = (int)(fVar129 - 2.1474836e+09);
            auVar127._8_4_ = (int)(fVar131 - 2.1474836e+09);
            auVar127._12_4_ = (int)(fVar133 - 2.1474836e+09);
            auVar128 = auVar127 & auVar172 | auVar128;
            auVar167._0_4_ = (int)fVar135;
            auVar167._4_4_ = (int)fVar144;
            auVar167._8_4_ = (int)fVar146;
            auVar167._12_4_ = (int)fVar148;
            auVar175._0_4_ = auVar167._0_4_ >> 0x1f;
            auVar175._4_4_ = auVar167._4_4_ >> 0x1f;
            auVar175._8_4_ = auVar167._8_4_ >> 0x1f;
            auVar175._12_4_ = auVar167._12_4_ >> 0x1f;
            auVar166._0_4_ = (int)(fVar135 - 2.1474836e+09);
            auVar166._4_4_ = (int)(fVar144 - 2.1474836e+09);
            auVar166._8_4_ = (int)(fVar146 - 2.1474836e+09);
            auVar166._12_4_ = (int)(fVar148 - 2.1474836e+09);
            auVar167 = auVar166 & auVar175 | auVar167;
            auVar152._0_4_ = (int)fVar149;
            auVar152._4_4_ = (int)fVar155;
            auVar152._8_4_ = (int)fVar157;
            auVar152._12_4_ = (int)fVar159;
            auVar173._0_4_ = auVar152._0_4_ >> 0x1f;
            auVar173._4_4_ = auVar152._4_4_ >> 0x1f;
            auVar173._8_4_ = auVar152._8_4_ >> 0x1f;
            auVar173._12_4_ = auVar152._12_4_ >> 0x1f;
            auVar151._0_4_ = (int)(fVar149 - 2.1474836e+09);
            auVar151._4_4_ = (int)(fVar155 - 2.1474836e+09);
            auVar151._8_4_ = (int)(fVar157 - 2.1474836e+09);
            auVar151._12_4_ = (int)(fVar159 - 2.1474836e+09);
            auVar152 = auVar151 & auVar173 | auVar152;
            auVar126 = auVar152 ^ auVar105;
            auVar141._0_4_ = -(uint)(auVar126._0_4_ < -0x7fffff01);
            auVar141._4_4_ = -(uint)(auVar126._4_4_ < -0x7fffff01);
            auVar141._8_4_ = -(uint)(auVar126._8_4_ < -0x7fffff01);
            auVar141._12_4_ = -(uint)(auVar126._12_4_ < -0x7fffff01);
            auVar126 = ~auVar141 & _DAT_001f6ed0 | auVar152 & auVar141;
            auVar116 = auVar167 ^ auVar105;
            auVar174._0_4_ = -(uint)(auVar116._0_4_ < -0x7fffff01);
            auVar174._4_4_ = -(uint)(auVar116._4_4_ < -0x7fffff01);
            auVar174._8_4_ = -(uint)(auVar116._8_4_ < -0x7fffff01);
            auVar174._12_4_ = -(uint)(auVar116._12_4_ < -0x7fffff01);
            auVar116 = ~auVar174 & _DAT_001f6ed0 | auVar167 & auVar174;
            sVar23 = auVar126._0_2_;
            cVar10 = (0 < sVar23) * (sVar23 < 0x100) * auVar126[0] - (0xff < sVar23);
            sVar23 = auVar126._2_2_;
            sVar134 = CONCAT11((0 < sVar23) * (sVar23 < 0x100) * auVar126[2] - (0xff < sVar23),
                               cVar10);
            sVar23 = auVar126._4_2_;
            cVar101 = (0 < sVar23) * (sVar23 < 0x100) * auVar126[4] - (0xff < sVar23);
            sVar23 = auVar126._6_2_;
            uVar136 = CONCAT13((0 < sVar23) * (sVar23 < 0x100) * auVar126[6] - (0xff < sVar23),
                               CONCAT12(cVar101,sVar134));
            sVar23 = auVar126._8_2_;
            cVar11 = (0 < sVar23) * (sVar23 < 0x100) * auVar126[8] - (0xff < sVar23);
            sVar23 = auVar126._10_2_;
            uVar137 = CONCAT15((0 < sVar23) * (sVar23 < 0x100) * auVar126[10] - (0xff < sVar23),
                               CONCAT14(cVar11,uVar136));
            sVar23 = auVar126._12_2_;
            cVar12 = (0 < sVar23) * (sVar23 < 0x100) * auVar126[0xc] - (0xff < sVar23);
            sVar23 = auVar126._14_2_;
            uVar138 = CONCAT17((0 < sVar23) * (sVar23 < 0x100) * auVar126[0xe] - (0xff < sVar23),
                               CONCAT16(cVar12,uVar137));
            sVar23 = auVar116._0_2_;
            cVar13 = (0 < sVar23) * (sVar23 < 0x100) * auVar116[0] - (0xff < sVar23);
            sVar23 = auVar116._2_2_;
            auVar139._0_10_ =
                 CONCAT19((0 < sVar23) * (sVar23 < 0x100) * auVar116[2] - (0xff < sVar23),
                          CONCAT18(cVar13,uVar138));
            sVar23 = auVar116._4_2_;
            cVar14 = (0 < sVar23) * (sVar23 < 0x100) * auVar116[4] - (0xff < sVar23);
            auVar139[10] = cVar14;
            sVar23 = auVar116._6_2_;
            auVar139[0xb] = (0 < sVar23) * (sVar23 < 0x100) * auVar116[6] - (0xff < sVar23);
            sVar23 = auVar116._8_2_;
            cVar103 = (0 < sVar23) * (sVar23 < 0x100) * auVar116[8] - (0xff < sVar23);
            auVar140[0xc] = cVar103;
            auVar140._0_12_ = auVar139;
            sVar23 = auVar116._10_2_;
            auVar140[0xd] = (0 < sVar23) * (sVar23 < 0x100) * auVar116[10] - (0xff < sVar23);
            sVar23 = auVar116._12_2_;
            cVar102 = (0 < sVar23) * (sVar23 < 0x100) * auVar116[0xc] - (0xff < sVar23);
            auVar142[0xe] = cVar102;
            auVar142._0_14_ = auVar140;
            sVar23 = auVar116._14_2_;
            auVar142[0xf] = (0 < sVar23) * (sVar23 < 0x100) * auVar116[0xe] - (0xff < sVar23);
            auVar126 = auVar128 ^ auVar105;
            auVar168._0_4_ = -(uint)(auVar126._0_4_ < -0x7fffff01);
            auVar168._4_4_ = -(uint)(auVar126._4_4_ < -0x7fffff01);
            auVar168._8_4_ = -(uint)(auVar126._8_4_ < -0x7fffff01);
            auVar168._12_4_ = -(uint)(auVar126._12_4_ < -0x7fffff01);
            auVar116 = ~auVar168 & _DAT_001f6ed0 | auVar128 & auVar168;
            auVar126 = auVar120 ^ auVar105;
            auVar153._0_4_ = -(uint)(auVar126._0_4_ < -0x7fffff01);
            auVar153._4_4_ = -(uint)(auVar126._4_4_ < -0x7fffff01);
            auVar153._8_4_ = -(uint)(auVar126._8_4_ < -0x7fffff01);
            auVar153._12_4_ = -(uint)(auVar126._12_4_ < -0x7fffff01);
            auVar126 = ~auVar153 & _DAT_001f6ed0 | auVar120 & auVar153;
            sVar23 = auVar116._0_2_;
            cVar15 = (0 < sVar23) * (sVar23 < 0x100) * auVar116[0] - (0xff < sVar23);
            sVar23 = auVar116._2_2_;
            sVar160 = CONCAT11((0 < sVar23) * (sVar23 < 0x100) * auVar116[2] - (0xff < sVar23),
                               cVar15);
            sVar23 = auVar116._4_2_;
            cVar16 = (0 < sVar23) * (sVar23 < 0x100) * auVar116[4] - (0xff < sVar23);
            sVar23 = auVar116._6_2_;
            uVar161 = CONCAT13((0 < sVar23) * (sVar23 < 0x100) * auVar116[6] - (0xff < sVar23),
                               CONCAT12(cVar16,sVar160));
            sVar23 = auVar116._8_2_;
            cVar17 = (0 < sVar23) * (sVar23 < 0x100) * auVar116[8] - (0xff < sVar23);
            sVar23 = auVar116._10_2_;
            uVar162 = CONCAT15((0 < sVar23) * (sVar23 < 0x100) * auVar116[10] - (0xff < sVar23),
                               CONCAT14(cVar17,uVar161));
            sVar23 = auVar116._12_2_;
            cVar18 = (0 < sVar23) * (sVar23 < 0x100) * auVar116[0xc] - (0xff < sVar23);
            sVar23 = auVar116._14_2_;
            uVar163 = CONCAT17((0 < sVar23) * (sVar23 < 0x100) * auVar116[0xe] - (0xff < sVar23),
                               CONCAT16(cVar18,uVar162));
            sVar23 = auVar126._0_2_;
            cVar19 = (0 < sVar23) * (sVar23 < 0x100) * auVar126[0] - (0xff < sVar23);
            sVar23 = auVar126._2_2_;
            auVar164._0_10_ =
                 CONCAT19((0 < sVar23) * (sVar23 < 0x100) * auVar126[2] - (0xff < sVar23),
                          CONCAT18(cVar19,uVar163));
            sVar23 = auVar126._4_2_;
            cVar20 = (0 < sVar23) * (sVar23 < 0x100) * auVar126[4] - (0xff < sVar23);
            auVar164[10] = cVar20;
            sVar23 = auVar126._6_2_;
            auVar164[0xb] = (0 < sVar23) * (sVar23 < 0x100) * auVar126[6] - (0xff < sVar23);
            sVar23 = auVar126._8_2_;
            cVar21 = (0 < sVar23) * (sVar23 < 0x100) * auVar126[8] - (0xff < sVar23);
            auVar165[0xc] = cVar21;
            auVar165._0_12_ = auVar164;
            sVar23 = auVar126._10_2_;
            auVar165[0xd] = (0 < sVar23) * (sVar23 < 0x100) * auVar126[10] - (0xff < sVar23);
            sVar23 = auVar126._12_2_;
            cVar22 = (0 < sVar23) * (sVar23 < 0x100) * auVar126[0xc] - (0xff < sVar23);
            auVar169[0xe] = cVar22;
            auVar169._0_14_ = auVar165;
            sVar23 = auVar126._14_2_;
            auVar169[0xf] = (0 < sVar23) * (sVar23 < 0x100) * auVar126[0xe] - (0xff < sVar23);
            sVar23 = (short)((uint)uVar161 >> 0x10);
            auVar170[1] = (0 < sVar23) * (sVar23 < 0x100) * cVar16 - (0xff < sVar23);
            auVar170[0] = (0 < sVar160) * (sVar160 < 0x100) * cVar15 - (0xff < sVar160);
            sVar23 = (short)((uint6)uVar162 >> 0x20);
            auVar170[2] = (0 < sVar23) * (sVar23 < 0x100) * cVar17 - (0xff < sVar23);
            sVar23 = (short)((ulong)uVar163 >> 0x30);
            auVar170[3] = (0 < sVar23) * (sVar23 < 0x100) * cVar18 - (0xff < sVar23);
            sVar23 = (short)((unkuint10)auVar164._0_10_ >> 0x40);
            auVar170[4] = (0 < sVar23) * (sVar23 < 0x100) * cVar19 - (0xff < sVar23);
            sVar23 = auVar164._10_2_;
            auVar170[5] = (0 < sVar23) * (sVar23 < 0x100) * cVar20 - (0xff < sVar23);
            sVar23 = auVar165._12_2_;
            auVar170[6] = (0 < sVar23) * (sVar23 < 0x100) * cVar21 - (0xff < sVar23);
            sVar23 = auVar169._14_2_;
            auVar170[7] = (0 < sVar23) * (sVar23 < 0x100) * cVar22 - (0xff < sVar23);
            auVar170[8] = (0 < sVar134) * (sVar134 < 0x100) * cVar10 - (0xff < sVar134);
            sVar23 = (short)((uint)uVar136 >> 0x10);
            auVar170[9] = (0 < sVar23) * (sVar23 < 0x100) * cVar101 - (0xff < sVar23);
            sVar23 = (short)((uint6)uVar137 >> 0x20);
            auVar170[10] = (0 < sVar23) * (sVar23 < 0x100) * cVar11 - (0xff < sVar23);
            sVar23 = (short)((ulong)uVar138 >> 0x30);
            auVar170[0xb] = (0 < sVar23) * (sVar23 < 0x100) * cVar12 - (0xff < sVar23);
            sVar23 = (short)((unkuint10)auVar139._0_10_ >> 0x40);
            auVar170[0xc] = (0 < sVar23) * (sVar23 < 0x100) * cVar13 - (0xff < sVar23);
            sVar23 = auVar139._10_2_;
            auVar170[0xd] = (0 < sVar23) * (sVar23 < 0x100) * cVar14 - (0xff < sVar23);
            sVar23 = auVar140._12_2_;
            auVar170[0xe] = (0 < sVar23) * (sVar23 < 0x100) * cVar103 - (0xff < sVar23);
            sVar23 = auVar142._14_2_;
            auVar170[0xf] = (0 < sVar23) * (sVar23 < 0x100) * cVar102 - (0xff < sVar23);
            *(undefined1 (*) [16])((long)&local_238[0].data + lVar72) = auVar170;
            lVar72 = lVar72 + 0x10;
            iVar69 = (int)DAT_001f6ee0;
            auVar107._0_4_ = auVar107._0_4_ + iVar69;
            iVar80 = DAT_001f6ee0._4_4_;
            auVar107._4_4_ = uVar85 + iVar80;
            iVar50 = DAT_001f6ee0._8_4_;
            auVar107._8_4_ = uVar130 + iVar50;
            iVar71 = DAT_001f6ee0._12_4_;
            auVar107._12_4_ = uVar132 + iVar71;
            auVar110._0_4_ = auVar110._0_4_ + iVar69;
            auVar110._4_4_ = uVar49 + iVar80;
            auVar110._8_4_ = uVar87 + iVar50;
            auVar110._12_4_ = uVar52 + iVar71;
            auVar114._0_4_ = auVar114._0_4_ + iVar69;
            auVar114._4_4_ = uVar154 + iVar80;
            auVar114._8_4_ = uVar156 + iVar50;
            auVar114._12_4_ = uVar158 + iVar71;
            auVar115._0_4_ = auVar115._0_4_ + iVar69;
            auVar115._4_4_ = uVar143 + iVar80;
            auVar115._8_4_ = uVar145 + iVar50;
            auVar115._12_4_ = uVar147 + iVar71;
          } while (lVar72 != 0x100);
          iVar69 = psVar89[1].cff.cursor;
          if (0 < iVar69) {
            lVar68._0_4_ = psVar89[1].hmtx;
            lVar68._4_4_ = psVar89[1].kern;
            iVar80 = 0;
            do {
              if ((*(int *)(lVar68 + 0x14) != 0) && (0 < *(int *)(lVar68 + 8))) {
                iVar69 = *(int *)(lVar68 + 4);
                iVar50 = atlas_00->TexWidth;
                pbVar88 = atlas_00->TexPixelsAlpha8 +
                          (long)*(int *)(lVar68 + 0x10) * (long)iVar50 +
                          (long)*(int *)(lVar68 + 0xc);
                iVar71 = *(int *)(lVar68 + 8);
                do {
                  uVar49 = iVar69 + 1;
                  if (0 < iVar69) {
                    do {
                      *pbVar88 = *(byte *)((long)&local_238[0].data + (ulong)*pbVar88);
                      pbVar88 = pbVar88 + 1;
                      uVar49 = uVar49 - 1;
                    } while (1 < uVar49);
                  }
                  pbVar88 = pbVar88 + ((long)iVar50 - (long)iVar69);
                  bVar90 = 1 < iVar71;
                  iVar71 = iVar71 + -1;
                } while (bVar90);
                iVar69 = psVar89[1].cff.cursor;
              }
              iVar80 = iVar80 + 1;
              lVar68 = lVar68 + 0x18;
            } while (iVar80 < iVar69);
          }
        }
        psVar89[1].hmtx = 0;
        psVar89[1].kern = 0;
      }
      lVar72 = local_330 + 1;
    } while (lVar72 < (int)local_408);
  }
  ImGui::MemFree(local_460);
  ImGui::MemFree(local_338);
  pvVar57 = pvStack_420;
  if (pvStack_420 != (void *)0x0) {
    auVar27._8_8_ = 0;
    auVar27._0_8_ = pvStack_420;
    _local_428 = (stbtt__buf)(auVar27 << 0x40);
    ImGui::MemFree(pvVar57);
    pvStack_420._0_4_ = 0;
    pvStack_420._4_4_ = 0;
  }
  local_480._8_8_ = (long)(int)local_408;
  pvVar57 = pvStack_400;
  if ((long)(int)local_408 < 1) {
    if (pvStack_400 == (void *)0x0) goto LAB_001a6657;
  }
  else {
    uVar86 = 0;
    uVar136 = SUB84(pvStack_400,0);
    uVar161 = (undefined4)((ulong)pvStack_400 >> 0x20);
    do {
      lVar68 = uVar86 * 0x110;
      pIVar83 = (local_498->ConfigData).Data;
      pIVar67 = pIVar83 + uVar86;
      lVar81 = *(long *)((long)pvVar57 + lVar68 + 8);
      lVar72 = (long)*(int *)((long)pvVar57 + lVar68 + 0x24);
      uVar49 = (int)(short)((ushort)*(byte *)(lVar81 + 4 + lVar72) << 8) |
               (uint)*(byte *)(lVar81 + 5 + lVar72);
      uVar87 = (int)(short)((ushort)*(byte *)(lVar81 + 6 + lVar72) << 8) |
               (uint)*(byte *)(lVar81 + 7 + lVar72);
      pIVar7 = pIVar83[uVar86].DstFont;
      fVar109 = pIVar83[uVar86].SizePixels / (float)(int)(uVar49 - uVar87);
      fVar93 = ceilf((float)(int)uVar49 * fVar109);
      if (pIVar83[uVar86].MergeMode == true) {
        fVar93 = pIVar7->Ascent;
      }
      else {
        ImFont::ClearOutputData(pIVar7);
        fVar109 = fVar109 * (float)(int)uVar87;
        pIVar7->FontSize = pIVar67->SizePixels;
        pIVar7->ContainerAtlas = local_498;
        pIVar7->Ascent = fVar93;
        pIVar7->Descent =
             (float)(int)((int)fVar109 - (uint)(fVar109 < 0.0 && (float)(int)fVar109 != fVar109));
      }
      pvVar57 = (void *)CONCAT44(uVar161,uVar136);
      if (0 < *(int *)((long)pvVar57 + lVar68 + 0xe8)) {
        fVar109 = (pIVar67->GlyphOffset).x;
        fVar93 = (float)(int)(fVar93 + 0.5) + (pIVar67->GlyphOffset).y;
        fVar108 = 1.0 / pIVar67->RasterizerDensity;
        lVar72 = 0;
        lVar81 = 0;
        do {
          lVar58 = *(long *)((long)pvVar57 + lVar68 + 0xd0);
          fVar122 = 1.0 / (float)local_498->TexHeight;
          fVar121 = 1.0 / (float)local_498->TexWidth;
          ImFont::AddGlyph(pIVar7,pIVar67,
                           *(ImWchar *)(*(long *)((long)pvVar57 + lVar68 + 0x108) + lVar81 * 4),
                           (*(float *)(lVar58 + 8 + lVar72) + 0.0) * fVar108 + fVar109,
                           (*(float *)(lVar58 + 0xc + lVar72) + 0.0) * fVar108 + fVar93,
                           (*(float *)(lVar58 + 0x14 + lVar72) + 0.0) * fVar108 + fVar109,
                           (*(float *)(lVar58 + 0x18 + lVar72) + 0.0) * fVar108 + fVar93,
                           (float)*(ushort *)(lVar58 + lVar72) * fVar121,
                           (float)*(ushort *)(lVar58 + 2 + lVar72) * fVar122,
                           (float)*(ushort *)(lVar58 + 4 + lVar72) * fVar121,
                           (float)*(ushort *)(lVar58 + 6 + lVar72) * fVar122,
                           *(float *)(lVar58 + 0x10 + lVar72) * fVar108);
          lVar81 = lVar81 + 1;
          lVar72 = lVar72 + 0x1c;
        } while (lVar81 < *(int *)((long)pvVar57 + lVar68 + 0xe8));
      }
      atlas_00 = local_498;
      uVar86 = uVar86 + 1;
    } while (uVar86 < (ulong)local_480._8_8_);
    if (0 < (int)local_480._8_4_) {
      puVar61 = (undefined8 *)((long)pvVar57 + 0x108);
      uVar86 = 0;
      do {
        if ((void *)*puVar61 != (void *)0x0) {
          ImGui::MemFree((void *)*puVar61);
        }
        if ((void *)puVar61[-2] != (void *)0x0) {
          ImGui::MemFree((void *)puVar61[-2]);
        }
        uVar86 = uVar86 + 1;
        puVar61 = puVar61 + 0x22;
      } while (uVar86 < (ulong)local_480._8_8_);
    }
  }
  local_408 = 0;
  ImGui::MemFree(pvVar57);
  pvStack_400 = (void *)0x0;
LAB_001a6657:
  ImFontAtlasBuildFinish(atlas_00);
  if (pvStack_3a0 != (void *)0x0) {
    ImGui::MemFree(pvStack_3a0);
  }
  bVar90 = true;
  pvVar57 = (void *)0x0;
LAB_001a6676:
  if (pvStack_3d0 != (void *)0x0) {
    ImGui::MemFree(pvStack_3d0);
  }
  if (pvVar57 != (void *)0x0) {
    ImGui::MemFree(pvVar57);
  }
  return bVar90;
}

Assistant:

static bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildInit(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        if (src_tmp.DstIndex == -1)
        {
            IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
            return false;
        }
        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
        {
            IM_ASSERT(0 && "stbtt_InitFont(): failed to parse FontData. It is correct and complete? Check FontDataSize.");
            return false;
        }

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
        {
            // Check for valid range. This may also help detect *some* dangling pointers, because a common
            // user error is to setup ImFontConfig::GlyphRanges with a pointer to data that isn't persistent.
            IM_ASSERT(src_range[0] <= src_range[1]);
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        }
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.GlyphsSet.Create(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Create(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (unsigned int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (dst_tmp.GlyphsSet.TestBit(codepoint))    // Don't overwrite existing glyphs. We could make this an option for MergeMode (e.g. MergeOverwrite==true)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;

                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint);
                dst_tmp.GlyphsSet.SetBit(codepoint);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBitVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels * cfg.RasterizerDensity;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0.0f) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels * cfg.RasterizerDensity) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels * cfg.RasterizerDensity);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096 * 0.7f) ? 4096 : (surface_sqrt >= 2048 * 0.7f) ? 2048 : (surface_sqrt >= 1024 * 0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)IM_ALLOC(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        // When merging fonts with MergeMode=true:
        // - We can have multiple input fonts writing into a same destination font.
        // - dst_font->ConfigData is != from cfg which is our source configuration.
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont;

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImCeil(unscaled_ascent * font_scale);
        const float descent = ImFloor(unscaled_descent * font_scale);
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + IM_ROUND(dst_font->Ascent);

        const float inv_rasterization_scale = 1.0f / cfg.RasterizerDensity;

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            // Register glyph
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];
            stbtt_aligned_quad q;
            float unused_x = 0.0f, unused_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &unused_x, &unused_y, &q, 0);
            float x0 = q.x0 * inv_rasterization_scale + font_off_x;
            float y0 = q.y0 * inv_rasterization_scale + font_off_y;
            float x1 = q.x1 * inv_rasterization_scale + font_off_x;
            float y1 = q.y1 * inv_rasterization_scale + font_off_y;
            dst_font->AddGlyph(&cfg, (ImWchar)codepoint, x0, y0, x1, y1, q.s0, q.t0, q.s1, q.t1, pc.xadvance * inv_rasterization_scale);
        }
    }

    // Cleanup
    src_tmp_array.clear_destruct();

    ImFontAtlasBuildFinish(atlas);
    return true;
}